

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [12];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  ulong uVar66;
  int iVar67;
  ulong uVar68;
  uint uVar69;
  long lVar70;
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar138;
  uint uVar139;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar145;
  float fVar165;
  vint4 bi_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar166;
  vint4 bi_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar169 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar222;
  float fVar223;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar224;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar228;
  float fVar236;
  float fVar237;
  vint4 ai_2;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar238;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar239;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  vint4 ai;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  vint4 ai_1;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  float fVar255;
  float fVar262;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar261;
  undefined1 auVar258 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  float s;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 (*local_848) [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  Primitive *local_6b0;
  ulong local_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  RTCHitN local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar259 [64];
  
  PVar1 = prim[1];
  uVar68 = (ulong)(byte)PVar1;
  fVar203 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar79 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar204._0_4_ = fVar203 * auVar79._0_4_;
  auVar204._4_4_ = fVar203 * auVar79._4_4_;
  auVar204._8_4_ = fVar203 * auVar79._8_4_;
  auVar204._12_4_ = fVar203 * auVar79._12_4_;
  auVar87._0_4_ = fVar203 * auVar77._0_4_;
  auVar87._4_4_ = fVar203 * auVar77._4_4_;
  auVar87._8_4_ = fVar203 * auVar77._8_4_;
  auVar87._12_4_ = fVar203 * auVar77._12_4_;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar68 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar66 = (ulong)(uint)((int)(uVar68 * 9) * 2);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar68 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar72 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar270._4_4_ = auVar87._0_4_;
  auVar270._0_4_ = auVar87._0_4_;
  auVar270._8_4_ = auVar87._0_4_;
  auVar270._12_4_ = auVar87._0_4_;
  auVar86 = vshufps_avx(auVar87,auVar87,0x55);
  auVar78 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar203 = auVar78._0_4_;
  auVar184._0_4_ = fVar203 * auVar80._0_4_;
  fVar165 = auVar78._4_4_;
  auVar184._4_4_ = fVar165 * auVar80._4_4_;
  fVar222 = auVar78._8_4_;
  auVar184._8_4_ = fVar222 * auVar80._8_4_;
  fVar223 = auVar78._12_4_;
  auVar184._12_4_ = fVar223 * auVar80._12_4_;
  auVar167._0_4_ = auVar81._0_4_ * fVar203;
  auVar167._4_4_ = auVar81._4_4_ * fVar165;
  auVar167._8_4_ = auVar81._8_4_ * fVar222;
  auVar167._12_4_ = auVar81._12_4_ * fVar223;
  auVar146._0_4_ = auVar85._0_4_ * fVar203;
  auVar146._4_4_ = auVar85._4_4_ * fVar165;
  auVar146._8_4_ = auVar85._8_4_ * fVar222;
  auVar146._12_4_ = auVar85._12_4_ * fVar223;
  auVar78 = vfmadd231ps_fma(auVar184,auVar86,auVar77);
  auVar76 = vfmadd231ps_fma(auVar167,auVar86,auVar88);
  auVar86 = vfmadd231ps_fma(auVar146,auVar84,auVar86);
  auVar75 = vfmadd231ps_fma(auVar78,auVar270,auVar79);
  auVar76 = vfmadd231ps_fma(auVar76,auVar270,auVar82);
  auVar87 = vfmadd231ps_fma(auVar86,auVar83,auVar270);
  auVar271._4_4_ = auVar204._0_4_;
  auVar271._0_4_ = auVar204._0_4_;
  auVar271._8_4_ = auVar204._0_4_;
  auVar271._12_4_ = auVar204._0_4_;
  auVar86 = vshufps_avx(auVar204,auVar204,0x55);
  auVar78 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar203 = auVar78._0_4_;
  auVar274._0_4_ = fVar203 * auVar80._0_4_;
  fVar165 = auVar78._4_4_;
  auVar274._4_4_ = fVar165 * auVar80._4_4_;
  fVar222 = auVar78._8_4_;
  auVar274._8_4_ = fVar222 * auVar80._8_4_;
  fVar223 = auVar78._12_4_;
  auVar274._12_4_ = fVar223 * auVar80._12_4_;
  auVar229._0_4_ = auVar81._0_4_ * fVar203;
  auVar229._4_4_ = auVar81._4_4_ * fVar165;
  auVar229._8_4_ = auVar81._8_4_ * fVar222;
  auVar229._12_4_ = auVar81._12_4_ * fVar223;
  auVar205._0_4_ = auVar85._0_4_ * fVar203;
  auVar205._4_4_ = auVar85._4_4_ * fVar165;
  auVar205._8_4_ = auVar85._8_4_ * fVar222;
  auVar205._12_4_ = auVar85._12_4_ * fVar223;
  auVar77 = vfmadd231ps_fma(auVar274,auVar86,auVar77);
  auVar80 = vfmadd231ps_fma(auVar229,auVar86,auVar88);
  auVar88 = vfmadd231ps_fma(auVar205,auVar86,auVar84);
  auVar81 = vfmadd231ps_fma(auVar77,auVar271,auVar79);
  auVar84 = vfmadd231ps_fma(auVar80,auVar271,auVar82);
  auVar250._8_4_ = 0x7fffffff;
  auVar250._0_8_ = 0x7fffffff7fffffff;
  auVar250._12_4_ = 0x7fffffff;
  auVar85 = vfmadd231ps_fma(auVar88,auVar271,auVar83);
  auVar79 = vandps_avx(auVar75,auVar250);
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar79,auVar244,1);
  bVar7 = (bool)((byte)uVar66 & 1);
  auVar78._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar75._0_4_;
  bVar7 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar75._4_4_;
  bVar7 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar75._8_4_;
  bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar75._12_4_;
  auVar79 = vandps_avx(auVar76,auVar250);
  uVar66 = vcmpps_avx512vl(auVar79,auVar244,1);
  bVar7 = (bool)((byte)uVar66 & 1);
  auVar75._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar76._0_4_;
  bVar7 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar76._4_4_;
  bVar7 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar76._8_4_;
  bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar76._12_4_;
  auVar79 = vandps_avx(auVar87,auVar250);
  uVar66 = vcmpps_avx512vl(auVar79,auVar244,1);
  bVar7 = (bool)((byte)uVar66 & 1);
  auVar76._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._0_4_;
  bVar7 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._4_4_;
  bVar7 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._8_4_;
  bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._12_4_;
  auVar77 = vrcp14ps_avx512vl(auVar78);
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = 0x3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar78,auVar77,auVar245);
  auVar82 = vfmadd132ps_fma(auVar79,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar79 = vfnmadd213ps_fma(auVar75,auVar77,auVar245);
  auVar88 = vfmadd132ps_fma(auVar79,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar76);
  auVar79 = vfnmadd213ps_fma(auVar76,auVar77,auVar245);
  auVar83 = vfmadd132ps_fma(auVar79,auVar77,auVar77);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar81);
  auVar240._0_4_ = auVar82._0_4_ * auVar79._0_4_;
  auVar240._4_4_ = auVar82._4_4_ * auVar79._4_4_;
  auVar240._8_4_ = auVar82._8_4_ * auVar79._8_4_;
  auVar240._12_4_ = auVar82._12_4_ * auVar79._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar79 = vpmovsxwd_avx(auVar77);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar81);
  auVar78 = vpbroadcastd_avx512vl();
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar77 = vpmovsxwd_avx(auVar80);
  auVar185._0_4_ = auVar82._0_4_ * auVar79._0_4_;
  auVar185._4_4_ = auVar82._4_4_ * auVar79._4_4_;
  auVar185._8_4_ = auVar82._8_4_ * auVar79._8_4_;
  auVar185._12_4_ = auVar82._12_4_ * auVar79._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar68 * -2 + 6);
  auVar79 = vpmovsxwd_avx(auVar82);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar84);
  auVar246._0_4_ = auVar88._0_4_ * auVar79._0_4_;
  auVar246._4_4_ = auVar88._4_4_ * auVar79._4_4_;
  auVar246._8_4_ = auVar88._8_4_ * auVar79._8_4_;
  auVar246._12_4_ = auVar88._12_4_ * auVar79._12_4_;
  auVar79 = vcvtdq2ps_avx(auVar77);
  auVar79 = vsubps_avx(auVar79,auVar84);
  auVar168._0_4_ = auVar88._0_4_ * auVar79._0_4_;
  auVar168._4_4_ = auVar88._4_4_ * auVar79._4_4_;
  auVar168._8_4_ = auVar88._8_4_ * auVar79._8_4_;
  auVar168._12_4_ = auVar88._12_4_ * auVar79._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 + uVar68 + 6);
  auVar79 = vpmovsxwd_avx(auVar88);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar85);
  auVar230._0_4_ = auVar83._0_4_ * auVar79._0_4_;
  auVar230._4_4_ = auVar83._4_4_ * auVar79._4_4_;
  auVar230._8_4_ = auVar83._8_4_ * auVar79._8_4_;
  auVar230._12_4_ = auVar83._12_4_ * auVar79._12_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 6);
  auVar79 = vpmovsxwd_avx(auVar81);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar79 = vsubps_avx(auVar79,auVar85);
  auVar147._0_4_ = auVar83._0_4_ * auVar79._0_4_;
  auVar147._4_4_ = auVar83._4_4_ * auVar79._4_4_;
  auVar147._8_4_ = auVar83._8_4_ * auVar79._8_4_;
  auVar147._12_4_ = auVar83._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar240,auVar185);
  auVar77 = vpminsd_avx(auVar246,auVar168);
  auVar79 = vmaxps_avx(auVar79,auVar77);
  auVar77 = vpminsd_avx(auVar230,auVar147);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar83._4_4_ = uVar166;
  auVar83._0_4_ = uVar166;
  auVar83._8_4_ = uVar166;
  auVar83._12_4_ = uVar166;
  auVar77 = vmaxps_avx512vl(auVar77,auVar83);
  auVar79 = vmaxps_avx(auVar79,auVar77);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  local_560 = vmulps_avx512vl(auVar79,auVar84);
  auVar79 = vpmaxsd_avx(auVar240,auVar185);
  auVar77 = vpmaxsd_avx(auVar246,auVar168);
  auVar79 = vminps_avx(auVar79,auVar77);
  auVar77 = vpmaxsd_avx(auVar230,auVar147);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar85._4_4_ = uVar166;
  auVar85._0_4_ = uVar166;
  auVar85._8_4_ = uVar166;
  auVar85._12_4_ = uVar166;
  auVar77 = vminps_avx512vl(auVar77,auVar85);
  auVar79 = vminps_avx(auVar79,auVar77);
  auVar86._8_4_ = 0x3f800003;
  auVar86._0_8_ = 0x3f8000033f800003;
  auVar86._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar86);
  uVar15 = vcmpps_avx512vl(local_560,auVar79,2);
  local_6a8 = vpcmpgtd_avx512vl(auVar78,_DAT_01f7fcf0);
  local_6a8 = ((byte)uVar15 & 0xf) & local_6a8;
  if ((char)local_6a8 == '\0') {
    return;
  }
  local_848 = (undefined1 (*) [32])&local_3e0;
  local_540 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6b0 = prim;
LAB_01ac1580:
  lVar70 = 0;
  for (uVar66 = local_6a8; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar69 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar70 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar69].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar70 = *(long *)&pGVar4[1].time_range.upper;
  auVar79 = *(undefined1 (*) [16])(lVar70 + (long)p_Var5 * uVar66);
  auVar77 = *(undefined1 (*) [16])(lVar70 + (uVar66 + 1) * (long)p_Var5);
  local_6a8 = local_6a8 - 1 & local_6a8;
  if (local_6a8 != 0) {
    uVar68 = local_6a8 - 1 & local_6a8;
    for (uVar72 = local_6a8; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    }
    if (uVar68 != 0) {
      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar82 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar266._4_4_ = uVar166;
  auVar266._0_4_ = uVar166;
  auVar266._8_4_ = uVar166;
  auVar266._12_4_ = uVar166;
  fStack_5b0 = (float)uVar166;
  _local_5c0 = auVar266;
  fStack_5ac = (float)uVar166;
  fStack_5a8 = (float)uVar166;
  register0x0000151c = uVar166;
  uVar166 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar272._4_4_ = uVar166;
  auVar272._0_4_ = uVar166;
  auVar272._8_4_ = uVar166;
  auVar272._12_4_ = uVar166;
  local_5e0._16_4_ = uVar166;
  local_5e0._0_16_ = auVar272;
  local_5e0._20_4_ = uVar166;
  local_5e0._24_4_ = uVar166;
  local_5e0._28_4_ = uVar166;
  auVar80 = vunpcklps_avx(auVar266,auVar272);
  fVar203 = *(float *)(ray + k * 4 + 0xc0);
  auVar273._4_4_ = fVar203;
  auVar273._0_4_ = fVar203;
  auVar273._8_4_ = fVar203;
  auVar273._12_4_ = fVar203;
  local_600._16_4_ = fVar203;
  local_600._0_16_ = auVar273;
  local_600._20_4_ = fVar203;
  local_600._24_4_ = fVar203;
  local_600._28_4_ = fVar203;
  local_7f0 = vinsertps_avx(auVar80,auVar273,0x28);
  auVar241._0_4_ = auVar79._0_4_ + auVar77._0_4_;
  auVar241._4_4_ = auVar79._4_4_ + auVar77._4_4_;
  auVar241._8_4_ = auVar79._8_4_ + auVar77._8_4_;
  auVar241._12_4_ = auVar79._12_4_ + auVar77._12_4_;
  auVar19._8_4_ = 0x3f000000;
  auVar19._0_8_ = 0x3f0000003f000000;
  auVar19._12_4_ = 0x3f000000;
  auVar80 = vmulps_avx512vl(auVar241,auVar19);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar80 = vdpps_avx(auVar80,local_7f0,0x7f);
  fVar165 = *(float *)(ray + k * 4 + 0x60);
  auVar263 = ZEXT464((uint)fVar165);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar265 = ZEXT1664(local_800);
  auVar247._4_12_ = ZEXT812(0) << 0x20;
  auVar247._0_4_ = local_800._0_4_;
  auVar81 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar247);
  auVar88 = vfnmadd213ss_fma(auVar81,local_800,ZEXT416(0x40000000));
  local_320 = auVar80._0_4_ * auVar81._0_4_ * auVar88._0_4_;
  auVar248._4_4_ = local_320;
  auVar248._0_4_ = local_320;
  auVar248._8_4_ = local_320;
  auVar248._12_4_ = local_320;
  fStack_7d0 = local_320;
  _local_7e0 = auVar248;
  fStack_7cc = local_320;
  fStack_7c8 = local_320;
  fStack_7c4 = local_320;
  auVar80 = vfmadd231ps_fma(auVar82,local_7f0,auVar248);
  auVar80 = vblendps_avx(auVar80,ZEXT816(0) << 0x40,8);
  auVar79 = vsubps_avx(auVar79,auVar80);
  auVar82 = vsubps_avx(*(undefined1 (*) [16])(lVar70 + (uVar66 + 2) * (long)p_Var5),auVar80);
  auVar254 = ZEXT1664(auVar82);
  auVar77 = vsubps_avx(auVar77,auVar80);
  auVar258 = ZEXT1664(auVar77);
  auVar80 = vsubps_avx(*(undefined1 (*) [16])(lVar70 + (uVar66 + 3) * (long)p_Var5),auVar80);
  auVar89 = vbroadcastss_avx512vl(auVar79);
  auVar94._8_4_ = 1;
  auVar94._0_8_ = 0x100000001;
  auVar94._12_4_ = 1;
  auVar94._16_4_ = 1;
  auVar94._20_4_ = 1;
  auVar94._24_4_ = 1;
  auVar94._28_4_ = 1;
  local_760 = ZEXT1632(auVar79);
  local_8c0 = vpermps_avx512vl(auVar94,local_760);
  auVar275 = ZEXT3264(local_8c0);
  auVar95._8_4_ = 2;
  auVar95._0_8_ = 0x200000002;
  auVar95._12_4_ = 2;
  auVar95._16_4_ = 2;
  auVar95._20_4_ = 2;
  auVar95._24_4_ = 2;
  auVar95._28_4_ = 2;
  local_8e0 = vpermps_avx512vl(auVar95,local_760);
  auVar276 = ZEXT3264(local_8e0);
  auVar96._8_4_ = 3;
  auVar96._0_8_ = 0x300000003;
  auVar96._12_4_ = 3;
  auVar96._16_4_ = 3;
  auVar96._20_4_ = 3;
  auVar96._24_4_ = 3;
  auVar96._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar96,local_760);
  local_900 = vbroadcastss_avx512vl(auVar77);
  auVar277 = ZEXT3264(local_900);
  local_7a0 = ZEXT1632(auVar77);
  auVar91 = vpermps_avx512vl(auVar94,local_7a0);
  auVar92 = vpermps_avx512vl(auVar95,local_7a0);
  local_920 = vpermps_avx512vl(auVar96,local_7a0);
  auVar278 = ZEXT3264(local_920);
  local_940 = vbroadcastss_avx512vl(auVar82);
  auVar279 = ZEXT3264(local_940);
  local_780 = ZEXT1632(auVar82);
  local_960 = vpermps_avx512vl(auVar94,local_780);
  auVar280 = ZEXT3264(local_960);
  local_280 = vpermps_avx512vl(auVar95,local_780);
  local_2a0 = vpermps_avx512vl(auVar96,local_780);
  local_260 = vbroadcastss_avx512vl(auVar80);
  _local_7c0 = ZEXT1632(auVar80);
  local_2e0 = vpermps_avx2(auVar94,_local_7c0);
  local_220 = vpermps_avx2(auVar95,_local_7c0);
  local_300 = vpermps_avx2(auVar96,_local_7c0);
  auVar79 = vfmadd231ps_fma(ZEXT432((uint)(fVar203 * fVar203)),local_5e0,local_5e0);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),_local_5c0,_local_5c0);
  local_240._0_4_ = auVar79._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar93);
  local_6f0 = ZEXT416((uint)local_320);
  local_320 = fVar165 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_4e0 = vpbroadcastd_avx512vl();
  iVar67 = 1;
  uVar66 = 0;
  local_500 = vpbroadcastd_avx512vl();
  auVar79 = vsqrtss_avx(local_800,local_800);
  auVar77 = vsqrtss_avx(local_800,local_800);
  local_550 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar281 = ZEXT3264(auVar93);
  local_2c0 = local_260;
  do {
    auVar80 = vmovshdup_avx(local_550);
    auVar80 = vsubps_avx(auVar80,local_550);
    auVar156._0_4_ = auVar80._0_4_;
    fVar145 = auVar156._0_4_ * 0.04761905;
    uVar166 = local_550._0_4_;
    auVar233._4_4_ = uVar166;
    auVar233._0_4_ = uVar166;
    auVar233._8_4_ = uVar166;
    auVar233._12_4_ = uVar166;
    auVar233._16_4_ = uVar166;
    auVar233._20_4_ = uVar166;
    auVar233._24_4_ = uVar166;
    auVar233._28_4_ = uVar166;
    auVar156._4_4_ = auVar156._0_4_;
    auVar156._8_4_ = auVar156._0_4_;
    auVar156._12_4_ = auVar156._0_4_;
    auVar156._16_4_ = auVar156._0_4_;
    auVar156._20_4_ = auVar156._0_4_;
    auVar156._24_4_ = auVar156._0_4_;
    auVar156._28_4_ = auVar156._0_4_;
    auVar80 = vfmadd231ps_fma(auVar233,auVar156,_DAT_01faff20);
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar93 = vsubps_avx512vl(auVar93,ZEXT1632(auVar80));
    auVar94 = vxorps_avx512vl(ZEXT1632(auVar80),auVar281._0_32_);
    fVar226 = auVar93._0_4_;
    fVar227 = auVar93._4_4_;
    fVar228 = auVar93._8_4_;
    fVar236 = auVar93._12_4_;
    fVar237 = auVar93._16_4_;
    fVar238 = auVar93._20_4_;
    fVar239 = auVar93._24_4_;
    auVar98._4_4_ = fVar227 * fVar227 * auVar94._4_4_;
    auVar98._0_4_ = fVar226 * fVar226 * auVar94._0_4_;
    auVar98._8_4_ = fVar228 * fVar228 * auVar94._8_4_;
    auVar98._12_4_ = fVar236 * fVar236 * auVar94._12_4_;
    auVar98._16_4_ = fVar237 * fVar237 * auVar94._16_4_;
    auVar98._20_4_ = fVar238 * fVar238 * auVar94._20_4_;
    auVar98._24_4_ = fVar239 * fVar239 * auVar94._24_4_;
    auVar98._28_4_ = auVar94._28_4_;
    fVar222 = auVar80._0_4_;
    fVar223 = auVar80._4_4_;
    fVar224 = auVar80._8_4_;
    fVar225 = auVar80._12_4_;
    auVar254._0_28_ =
         ZEXT1628(CONCAT412(fVar225 * fVar225,
                            CONCAT48(fVar224 * fVar224,CONCAT44(fVar223 * fVar223,fVar222 * fVar222)
                                    )));
    fVar255 = fVar222 * 3.0;
    fVar260 = fVar223 * 3.0;
    fVar261 = fVar224 * 3.0;
    fVar262 = fVar225 * 3.0;
    auVar259._28_36_ = auVar258._28_36_;
    auVar259._0_28_ = ZEXT1628(CONCAT412(fVar262,CONCAT48(fVar261,CONCAT44(fVar260,fVar255))));
    auVar115._0_4_ = (fVar255 + -5.0) * fVar222 * fVar222;
    auVar115._4_4_ = (fVar260 + -5.0) * fVar223 * fVar223;
    auVar115._8_4_ = (fVar261 + -5.0) * fVar224 * fVar224;
    auVar115._12_4_ = (fVar262 + -5.0) * fVar225 * fVar225;
    auVar115._16_4_ = 0x80000000;
    auVar115._20_4_ = 0x80000000;
    auVar115._24_4_ = 0x80000000;
    auVar115._28_4_ = 0;
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar95 = vaddps_avx512vl(auVar115,auVar94);
    auVar264._0_4_ = fVar226 * fVar226;
    auVar264._4_4_ = fVar227 * fVar227;
    auVar264._8_4_ = fVar228 * fVar228;
    auVar264._12_4_ = fVar236 * fVar236;
    auVar264._16_4_ = fVar237 * fVar237;
    auVar264._20_4_ = fVar238 * fVar238;
    auVar264._28_36_ = auVar263._28_36_;
    auVar264._24_4_ = fVar239 * fVar239;
    auVar102._4_4_ = auVar264._4_4_ * (fVar227 * 3.0 + -5.0);
    auVar102._0_4_ = auVar264._0_4_ * (fVar226 * 3.0 + -5.0);
    auVar102._8_4_ = auVar264._8_4_ * (fVar228 * 3.0 + -5.0);
    auVar102._12_4_ = auVar264._12_4_ * (fVar236 * 3.0 + -5.0);
    auVar102._16_4_ = auVar264._16_4_ * (fVar237 * 3.0 + -5.0);
    auVar102._20_4_ = auVar264._20_4_ * (fVar238 * 3.0 + -5.0);
    auVar102._24_4_ = auVar264._24_4_ * (fVar239 * 3.0 + -5.0);
    auVar102._28_4_ = auVar265._28_4_ + -5.0;
    auVar96 = vaddps_avx512vl(auVar102,auVar94);
    auVar97 = vxorps_avx512vl(auVar93,auVar281._0_32_);
    auVar103._4_4_ = fVar223 * fVar223 * auVar97._4_4_;
    auVar103._0_4_ = fVar222 * fVar222 * auVar97._0_4_;
    auVar103._8_4_ = fVar224 * fVar224 * auVar97._8_4_;
    auVar103._12_4_ = fVar225 * fVar225 * auVar97._12_4_;
    auVar103._16_4_ = auVar97._16_4_ * 0.0 * 0.0;
    auVar103._20_4_ = auVar97._20_4_ * 0.0 * 0.0;
    auVar103._24_4_ = auVar97._24_4_ * 0.0 * 0.0;
    auVar103._28_4_ = auVar97._28_4_;
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar98 = vmulps_avx512vl(auVar98,auVar97);
    auVar99 = vmulps_avx512vl(auVar95,auVar97);
    auVar96 = vmulps_avx512vl(auVar96,auVar97);
    auVar100 = vmulps_avx512vl(auVar103,auVar97);
    auVar101 = vmulps_avx512vl(local_2c0,auVar100);
    auVar104._4_4_ = local_2e0._4_4_ * auVar100._4_4_;
    auVar104._0_4_ = local_2e0._0_4_ * auVar100._0_4_;
    auVar104._8_4_ = local_2e0._8_4_ * auVar100._8_4_;
    auVar104._12_4_ = local_2e0._12_4_ * auVar100._12_4_;
    auVar104._16_4_ = local_2e0._16_4_ * auVar100._16_4_;
    auVar104._20_4_ = local_2e0._20_4_ * auVar100._20_4_;
    auVar104._24_4_ = local_2e0._24_4_ * auVar100._24_4_;
    auVar104._28_4_ = auVar95._28_4_;
    auVar95 = vmulps_avx512vl(local_220,auVar100);
    auVar105._4_4_ = local_300._4_4_ * auVar100._4_4_;
    auVar105._0_4_ = local_300._0_4_ * auVar100._0_4_;
    auVar105._8_4_ = local_300._8_4_ * auVar100._8_4_;
    auVar105._12_4_ = local_300._12_4_ * auVar100._12_4_;
    auVar105._16_4_ = local_300._16_4_ * auVar100._16_4_;
    auVar105._20_4_ = local_300._20_4_ * auVar100._20_4_;
    auVar105._24_4_ = local_300._24_4_ * auVar100._24_4_;
    auVar105._28_4_ = auVar100._28_4_;
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar279._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar104,auVar96,auVar280._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,local_280);
    auVar96 = vfmadd231ps_avx512vl(auVar105,local_2a0,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar277._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar91);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar92);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar278._0_32_,auVar99);
    auVar102 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar89);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar275._0_32_);
    auVar104 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar276._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,auVar98);
    fVar203 = auVar93._28_4_;
    auVar106._4_4_ = (fVar227 + fVar227) * fVar223;
    auVar106._0_4_ = (fVar226 + fVar226) * fVar222;
    auVar106._8_4_ = (fVar228 + fVar228) * fVar224;
    auVar106._12_4_ = (fVar236 + fVar236) * fVar225;
    auVar106._16_4_ = (fVar237 + fVar237) * 0.0;
    auVar106._20_4_ = (fVar238 + fVar238) * 0.0;
    auVar106._24_4_ = (fVar239 + fVar239) * 0.0;
    auVar106._28_4_ = auVar99._28_4_;
    auVar93 = vsubps_avx(auVar106,auVar264._0_32_);
    auVar116._0_28_ =
         ZEXT1628(CONCAT412((fVar225 + fVar225) * (fVar262 + -5.0) + fVar262 * fVar225,
                            CONCAT48((fVar224 + fVar224) * (fVar261 + -5.0) + fVar261 * fVar224,
                                     CONCAT44((fVar223 + fVar223) * (fVar260 + -5.0) +
                                              fVar260 * fVar223,
                                              (fVar222 + fVar222) * (fVar255 + -5.0) +
                                              fVar255 * fVar222))));
    auVar116._28_4_ = auVar258._28_4_ + -5.0 + 0.0;
    auVar94 = vaddps_avx512vl(auVar259._0_32_,auVar94);
    auVar107._4_4_ = (fVar227 + fVar227) * auVar94._4_4_;
    auVar107._0_4_ = (fVar226 + fVar226) * auVar94._0_4_;
    auVar107._8_4_ = (fVar228 + fVar228) * auVar94._8_4_;
    auVar107._12_4_ = (fVar236 + fVar236) * auVar94._12_4_;
    auVar107._16_4_ = (fVar237 + fVar237) * auVar94._16_4_;
    auVar107._20_4_ = (fVar238 + fVar238) * auVar94._20_4_;
    auVar107._24_4_ = (fVar239 + fVar239) * auVar94._24_4_;
    auVar107._28_4_ = auVar94._28_4_;
    auVar108._4_4_ = fVar227 * 3.0 * fVar227;
    auVar108._0_4_ = fVar226 * 3.0 * fVar226;
    auVar108._8_4_ = fVar228 * 3.0 * fVar228;
    auVar108._12_4_ = fVar236 * 3.0 * fVar236;
    auVar108._16_4_ = fVar237 * 3.0 * fVar237;
    auVar108._20_4_ = fVar238 * 3.0 * fVar238;
    auVar108._24_4_ = fVar239 * 3.0 * fVar239;
    auVar108._28_4_ = fVar203;
    auVar94 = vsubps_avx(auVar107,auVar108);
    auVar95 = vsubps_avx(auVar254._0_32_,auVar106);
    auVar98 = vmulps_avx512vl(auVar93,auVar97);
    auVar100 = vmulps_avx512vl(auVar116,auVar97);
    auVar94 = vmulps_avx512vl(auVar94,auVar97);
    auVar95 = vmulps_avx512vl(auVar95,auVar97);
    auVar97 = vmulps_avx512vl(local_2c0,auVar95);
    auVar109._4_4_ = local_2e0._4_4_ * auVar95._4_4_;
    auVar109._0_4_ = local_2e0._0_4_ * auVar95._0_4_;
    auVar109._8_4_ = local_2e0._8_4_ * auVar95._8_4_;
    auVar109._12_4_ = local_2e0._12_4_ * auVar95._12_4_;
    auVar109._16_4_ = local_2e0._16_4_ * auVar95._16_4_;
    auVar109._20_4_ = local_2e0._20_4_ * auVar95._20_4_;
    auVar109._24_4_ = local_2e0._24_4_ * auVar95._24_4_;
    auVar109._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(local_220,auVar95);
    auVar110._4_4_ = local_300._4_4_ * auVar95._4_4_;
    auVar110._0_4_ = local_300._0_4_ * auVar95._0_4_;
    auVar110._8_4_ = local_300._8_4_ * auVar95._8_4_;
    auVar110._12_4_ = local_300._12_4_ * auVar95._12_4_;
    auVar110._16_4_ = local_300._16_4_ * auVar95._16_4_;
    auVar110._20_4_ = local_300._20_4_ * auVar95._20_4_;
    auVar110._24_4_ = local_300._24_4_ * auVar95._24_4_;
    auVar110._28_4_ = auVar95._28_4_;
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar279._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar109,auVar94,auVar280._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,local_280);
    auVar94 = vfmadd231ps_avx512vl(auVar110,local_2a0,auVar94);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar277._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar91);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar92);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar278._0_32_,auVar100);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar98,auVar275._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar276._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar98);
    auVar122._4_4_ = auVar95._4_4_ * fVar145;
    auVar122._0_4_ = auVar95._0_4_ * fVar145;
    auVar122._8_4_ = auVar95._8_4_ * fVar145;
    auVar122._12_4_ = auVar95._12_4_ * fVar145;
    auVar122._16_4_ = auVar95._16_4_ * fVar145;
    auVar122._20_4_ = auVar95._20_4_ * fVar145;
    auVar122._24_4_ = auVar95._24_4_ * fVar145;
    auVar122._28_4_ = fVar203 + fVar203;
    auVar123._4_4_ = auVar97._4_4_ * fVar145;
    auVar123._0_4_ = auVar97._0_4_ * fVar145;
    auVar123._8_4_ = auVar97._8_4_ * fVar145;
    auVar123._12_4_ = auVar97._12_4_ * fVar145;
    auVar123._16_4_ = auVar97._16_4_ * fVar145;
    auVar123._20_4_ = auVar97._20_4_ * fVar145;
    auVar123._24_4_ = auVar97._24_4_ * fVar145;
    auVar123._28_4_ = auVar99._28_4_;
    auVar124._4_4_ = auVar93._4_4_ * fVar145;
    auVar124._0_4_ = auVar93._0_4_ * fVar145;
    auVar124._8_4_ = auVar93._8_4_ * fVar145;
    auVar124._12_4_ = auVar93._12_4_ * fVar145;
    auVar124._16_4_ = auVar93._16_4_ * fVar145;
    auVar124._20_4_ = auVar93._20_4_ * fVar145;
    auVar124._24_4_ = auVar93._24_4_ * fVar145;
    auVar124._28_4_ = 0;
    fVar203 = fVar145 * auVar94._0_4_;
    fVar222 = fVar145 * auVar94._4_4_;
    auVar113._4_4_ = fVar222;
    auVar113._0_4_ = fVar203;
    fVar223 = fVar145 * auVar94._8_4_;
    auVar113._8_4_ = fVar223;
    fVar224 = fVar145 * auVar94._12_4_;
    auVar113._12_4_ = fVar224;
    fVar225 = fVar145 * auVar94._16_4_;
    auVar113._16_4_ = fVar225;
    fVar226 = fVar145 * auVar94._20_4_;
    auVar113._20_4_ = fVar226;
    fVar227 = fVar145 * auVar94._24_4_;
    auVar113._24_4_ = fVar227;
    auVar113._28_4_ = fVar145;
    auVar80 = vxorps_avx512vl(auVar278._0_16_,auVar278._0_16_);
    auVar105 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,ZEXT1632(auVar80));
    auVar106 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,ZEXT1632(auVar80));
    auVar263 = ZEXT3264(auVar106);
    auVar95 = ZEXT1632(auVar80);
    auVar107 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,auVar95);
    auVar265 = ZEXT3264(auVar107);
    auVar117._0_4_ = auVar96._0_4_ + fVar203;
    auVar117._4_4_ = auVar96._4_4_ + fVar222;
    auVar117._8_4_ = auVar96._8_4_ + fVar223;
    auVar117._12_4_ = auVar96._12_4_ + fVar224;
    auVar117._16_4_ = auVar96._16_4_ + fVar225;
    auVar117._20_4_ = auVar96._20_4_ + fVar226;
    auVar117._24_4_ = auVar96._24_4_ + fVar227;
    auVar117._28_4_ = auVar96._28_4_ + fVar145;
    auVar93 = vmaxps_avx(auVar96,auVar117);
    auVar94 = vminps_avx(auVar96,auVar117);
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar95);
    auVar108 = vpermt2ps_avx512vl(auVar122,_DAT_01feed00,auVar95);
    auVar258 = ZEXT3264(auVar108);
    auVar109 = vpermt2ps_avx512vl(auVar123,_DAT_01feed00,auVar95);
    auVar118 = ZEXT1632(auVar80);
    auVar110 = vpermt2ps_avx512vl(auVar124,_DAT_01feed00,auVar118);
    auVar95 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar118);
    auVar100 = vsubps_avx512vl(auVar99,auVar95);
    auVar95 = vsubps_avx(auVar105,auVar102);
    auVar254 = ZEXT3264(auVar95);
    auVar96 = vsubps_avx(auVar106,auVar103);
    auVar98 = vsubps_avx(auVar107,auVar104);
    auVar97 = vmulps_avx512vl(auVar96,auVar124);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar123,auVar98);
    auVar101 = vmulps_avx512vl(auVar98,auVar122);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar124,auVar95);
    auVar111 = vmulps_avx512vl(auVar95,auVar123);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar122,auVar96);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar101 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar101);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar111 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar95);
    auVar112 = vrcp14ps_avx512vl(auVar111);
    auVar97._8_4_ = 0x3f800000;
    auVar97._0_8_ = 0x3f8000003f800000;
    auVar97._12_4_ = 0x3f800000;
    auVar97._16_4_ = 0x3f800000;
    auVar97._20_4_ = 0x3f800000;
    auVar97._24_4_ = 0x3f800000;
    auVar97._28_4_ = 0x3f800000;
    auVar97 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar97);
    auVar97 = vfmadd132ps_avx512vl(auVar97,auVar112,auVar112);
    auVar101 = vmulps_avx512vl(auVar101,auVar97);
    auVar112 = vmulps_avx512vl(auVar96,auVar110);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar98);
    auVar113 = vmulps_avx512vl(auVar98,auVar108);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar110,auVar95);
    auVar114 = vmulps_avx512vl(auVar95,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar108,auVar96);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar97 = vmulps_avx512vl(auVar112,auVar97);
    auVar97 = vmaxps_avx512vl(auVar101,auVar97);
    auVar97 = vsqrtps_avx512vl(auVar97);
    auVar101 = vmaxps_avx512vl(auVar100,auVar99);
    auVar93 = vmaxps_avx512vl(auVar93,auVar101);
    auVar112 = vaddps_avx512vl(auVar97,auVar93);
    auVar93 = vminps_avx512vl(auVar100,auVar99);
    auVar93 = vminps_avx(auVar94,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar97);
    auVar99._8_4_ = 0x3f800002;
    auVar99._0_8_ = 0x3f8000023f800002;
    auVar99._12_4_ = 0x3f800002;
    auVar99._16_4_ = 0x3f800002;
    auVar99._20_4_ = 0x3f800002;
    auVar99._24_4_ = 0x3f800002;
    auVar99._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar112,auVar99);
    auVar100._8_4_ = 0x3f7ffffc;
    auVar100._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar100._12_4_ = 0x3f7ffffc;
    auVar100._16_4_ = 0x3f7ffffc;
    auVar100._20_4_ = 0x3f7ffffc;
    auVar100._24_4_ = 0x3f7ffffc;
    auVar100._28_4_ = 0x3f7ffffc;
    auVar93 = vmulps_avx512vl(auVar93,auVar100);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar97 = vrsqrt14ps_avx512vl(auVar111);
    auVar101._8_4_ = 0xbf000000;
    auVar101._0_8_ = 0xbf000000bf000000;
    auVar101._12_4_ = 0xbf000000;
    auVar101._16_4_ = 0xbf000000;
    auVar101._20_4_ = 0xbf000000;
    auVar101._24_4_ = 0xbf000000;
    auVar101._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar111,auVar101);
    fVar203 = auVar97._0_4_;
    fVar222 = auVar97._4_4_;
    fVar223 = auVar97._8_4_;
    fVar224 = auVar97._12_4_;
    fVar225 = auVar97._16_4_;
    fVar145 = auVar97._20_4_;
    fVar226 = auVar97._24_4_;
    auVar114._4_4_ = fVar222 * fVar222 * fVar222 * auVar99._4_4_;
    auVar114._0_4_ = fVar203 * fVar203 * fVar203 * auVar99._0_4_;
    auVar114._8_4_ = fVar223 * fVar223 * fVar223 * auVar99._8_4_;
    auVar114._12_4_ = fVar224 * fVar224 * fVar224 * auVar99._12_4_;
    auVar114._16_4_ = fVar225 * fVar225 * fVar225 * auVar99._16_4_;
    auVar114._20_4_ = fVar145 * fVar145 * fVar145 * auVar99._20_4_;
    auVar114._24_4_ = fVar226 * fVar226 * fVar226 * auVar99._24_4_;
    auVar114._28_4_ = auVar112._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar97 = vfmadd231ps_avx512vl(auVar114,auVar97,auVar111);
    auVar99 = vmulps_avx512vl(auVar95,auVar97);
    auVar100 = vmulps_avx512vl(auVar96,auVar97);
    auVar101 = vmulps_avx512vl(auVar98,auVar97);
    auVar111 = vsubps_avx512vl(auVar118,auVar102);
    auVar113 = vsubps_avx512vl(auVar118,auVar103);
    auVar114 = vsubps_avx512vl(auVar118,auVar104);
    auVar112 = vmulps_avx512vl(local_600,auVar114);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_5e0,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar112,_local_5c0,auVar111);
    auVar115 = vmulps_avx512vl(auVar114,auVar114);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar116 = vmulps_avx512vl(local_600,auVar101);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar100,local_5e0);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar99,_local_5c0);
    auVar101 = vmulps_avx512vl(auVar114,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar113,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar111,auVar99);
    auVar100 = vmulps_avx512vl(auVar116,auVar116);
    auVar101 = vsubps_avx512vl(local_240,auVar100);
    auVar117 = vmulps_avx512vl(auVar116,auVar99);
    auVar112 = vsubps_avx512vl(auVar112,auVar117);
    auVar117 = vaddps_avx512vl(auVar112,auVar112);
    auVar112 = vmulps_avx512vl(auVar99,auVar99);
    local_740 = vsubps_avx512vl(auVar115,auVar112);
    auVar94 = vsubps_avx512vl(local_740,auVar94);
    local_880 = vmulps_avx512vl(auVar117,auVar117);
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    _local_620 = vmulps_avx512vl(auVar101,auVar112);
    auVar112 = vmulps_avx512vl(_local_620,auVar94);
    auVar112 = vsubps_avx512vl(local_880,auVar112);
    uVar72 = vcmpps_avx512vl(auVar112,auVar118,5);
    bVar61 = (byte)uVar72;
    fVar203 = (float)local_7e0._0_4_;
    fVar222 = (float)local_7e0._4_4_;
    fVar223 = fStack_7d8;
    fVar224 = fStack_7d4;
    fVar225 = fStack_7d0;
    fVar145 = fStack_7cc;
    fVar226 = fStack_7c8;
    fVar227 = fStack_7c4;
    if (bVar61 == 0) {
LAB_01ac22a9:
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar281 = ZEXT3264(auVar93);
      auVar275 = ZEXT3264(local_8c0);
      auVar276 = ZEXT3264(local_8e0);
      auVar277 = ZEXT3264(local_900);
      auVar278 = ZEXT3264(local_920);
      auVar279 = ZEXT3264(local_940);
      auVar280 = ZEXT3264(local_960);
    }
    else {
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar115 = vaddps_avx512vl(auVar101,auVar101);
      local_840 = vrcp14ps_avx512vl(auVar115);
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = 0x3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
      auVar118 = vfnmadd213ps_avx512vl(local_840,auVar115,auVar118);
      auVar118 = vfmadd132ps_avx512vl(auVar118,local_840,local_840);
      auVar119._8_4_ = 0x80000000;
      auVar119._0_8_ = 0x8000000080000000;
      auVar119._12_4_ = 0x80000000;
      auVar119._16_4_ = 0x80000000;
      auVar119._20_4_ = 0x80000000;
      auVar119._24_4_ = 0x80000000;
      auVar119._28_4_ = 0x80000000;
      local_640 = vxorps_avx512vl(auVar117,auVar119);
      auVar119 = vsubps_avx512vl(local_640,auVar112);
      local_8a0 = vmulps_avx512vl(auVar119,auVar118);
      auVar112 = vsubps_avx512vl(auVar112,auVar117);
      local_660 = vmulps_avx512vl(auVar112,auVar118);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vblendmps_avx512vl(auVar112,local_8a0);
      auVar120._0_4_ =
           (uint)(bVar61 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar112._0_4_;
      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar7 * auVar118._4_4_ | (uint)!bVar7 * auVar112._4_4_;
      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar7 * auVar118._8_4_ | (uint)!bVar7 * auVar112._8_4_;
      bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar7 * auVar118._12_4_ | (uint)!bVar7 * auVar112._12_4_;
      bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar7 * auVar118._16_4_ | (uint)!bVar7 * auVar112._16_4_;
      bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar7 * auVar118._20_4_ | (uint)!bVar7 * auVar112._20_4_;
      bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar7 * auVar118._24_4_ | (uint)!bVar7 * auVar112._24_4_;
      bVar7 = SUB81(uVar72 >> 7,0);
      auVar120._28_4_ = (uint)bVar7 * auVar118._28_4_ | (uint)!bVar7 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar118 = vblendmps_avx512vl(auVar112,local_660);
      auVar121._0_4_ =
           (uint)(bVar61 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar112._0_4_;
      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar7 * auVar118._4_4_ | (uint)!bVar7 * auVar112._4_4_;
      bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar7 * auVar118._8_4_ | (uint)!bVar7 * auVar112._8_4_;
      bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar7 * auVar118._12_4_ | (uint)!bVar7 * auVar112._12_4_;
      bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar7 * auVar118._16_4_ | (uint)!bVar7 * auVar112._16_4_;
      bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar7 * auVar118._20_4_ | (uint)!bVar7 * auVar112._20_4_;
      bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar7 * auVar118._24_4_ | (uint)!bVar7 * auVar112._24_4_;
      bVar7 = SUB81(uVar72 >> 7,0);
      auVar121._28_4_ = (uint)bVar7 * auVar118._28_4_ | (uint)!bVar7 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar100,auVar112);
      local_680 = vmaxps_avx512vl(local_260,auVar112);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_680,auVar29);
      vandps_avx512vl(auVar101,auVar112);
      uVar68 = vcmpps_avx512vl(local_820,local_820,1);
      uVar72 = uVar72 & uVar68;
      bVar64 = (byte)uVar72;
      if (bVar64 != 0) {
        uVar68 = vcmpps_avx512vl(auVar94,_DAT_01faff00,2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar101 = vblendmps_avx512vl(auVar94,auVar100);
        bVar65 = (byte)uVar68;
        uVar74 = (uint)(bVar65 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar65 & 1) * local_820._0_4_;
        bVar7 = (bool)((byte)(uVar68 >> 1) & 1);
        uVar73 = (uint)bVar7 * auVar101._4_4_ | (uint)!bVar7 * local_820._4_4_;
        bVar7 = (bool)((byte)(uVar68 >> 2) & 1);
        uVar138 = (uint)bVar7 * auVar101._8_4_ | (uint)!bVar7 * local_820._8_4_;
        bVar7 = (bool)((byte)(uVar68 >> 3) & 1);
        uVar139 = (uint)bVar7 * auVar101._12_4_ | (uint)!bVar7 * local_820._12_4_;
        bVar7 = (bool)((byte)(uVar68 >> 4) & 1);
        uVar140 = (uint)bVar7 * auVar101._16_4_ | (uint)!bVar7 * local_820._16_4_;
        bVar7 = (bool)((byte)(uVar68 >> 5) & 1);
        uVar141 = (uint)bVar7 * auVar101._20_4_ | (uint)!bVar7 * local_820._20_4_;
        bVar7 = (bool)((byte)(uVar68 >> 6) & 1);
        uVar142 = (uint)bVar7 * auVar101._24_4_ | (uint)!bVar7 * local_820._24_4_;
        bVar7 = SUB81(uVar68 >> 7,0);
        uVar143 = (uint)bVar7 * auVar101._28_4_ | (uint)!bVar7 * local_820._28_4_;
        auVar120._0_4_ = (bVar64 & 1) * uVar74 | !(bool)(bVar64 & 1) * auVar120._0_4_;
        bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar120._4_4_ = bVar7 * uVar73 | !bVar7 * auVar120._4_4_;
        bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar120._8_4_ = bVar7 * uVar138 | !bVar7 * auVar120._8_4_;
        bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar120._12_4_ = bVar7 * uVar139 | !bVar7 * auVar120._12_4_;
        bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar120._16_4_ = bVar7 * uVar140 | !bVar7 * auVar120._16_4_;
        bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar120._20_4_ = bVar7 * uVar141 | !bVar7 * auVar120._20_4_;
        bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar120._24_4_ = bVar7 * uVar142 | !bVar7 * auVar120._24_4_;
        bVar7 = SUB81(uVar72 >> 7,0);
        auVar120._28_4_ = bVar7 * uVar143 | !bVar7 * auVar120._28_4_;
        auVar94 = vblendmps_avx512vl(auVar100,auVar94);
        bVar7 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar68 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar68 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar68 >> 6) & 1);
        bVar14 = SUB81(uVar68 >> 7,0);
        auVar121._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar65 & 1) * auVar94._0_4_ | !(bool)(bVar65 & 1) * uVar74) |
             !(bool)(bVar64 & 1) * auVar121._0_4_;
        bVar8 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar121._4_4_ =
             (uint)bVar8 * ((uint)bVar7 * auVar94._4_4_ | !bVar7 * uVar73) | !bVar8 * auVar121._4_4_
        ;
        bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar121._8_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar94._8_4_ | !bVar9 * uVar138) |
             !bVar7 * auVar121._8_4_;
        bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar121._12_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar94._12_4_ | !bVar10 * uVar139) |
             !bVar7 * auVar121._12_4_;
        bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar121._16_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar94._16_4_ | !bVar11 * uVar140) |
             !bVar7 * auVar121._16_4_;
        bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar121._20_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar94._20_4_ | !bVar12 * uVar141) |
             !bVar7 * auVar121._20_4_;
        bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar121._24_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar94._24_4_ | !bVar13 * uVar142) |
             !bVar7 * auVar121._24_4_;
        bVar7 = SUB81(uVar72 >> 7,0);
        auVar121._28_4_ =
             (uint)bVar7 * ((uint)bVar14 * auVar94._28_4_ | !bVar14 * uVar143) |
             !bVar7 * auVar121._28_4_;
        bVar61 = (~bVar64 | bVar65) & bVar61;
      }
      if ((bVar61 & 0x7f) == 0) goto LAB_01ac22a9;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar110 = vxorps_avx512vl(auVar110,auVar112);
      auVar108 = vxorps_avx512vl(auVar108,auVar112);
      uVar74 = *(uint *)(ray + k * 4 + 0x100);
      auVar109 = vxorps_avx512vl(auVar109,auVar112);
      local_860 = ZEXT416(uVar74);
      auVar80 = vsubss_avx512f(local_860,ZEXT416((uint)local_6f0._0_4_));
      auVar94 = vbroadcastss_avx512vl(auVar80);
      auVar118 = vminps_avx512vl(auVar94,auVar121);
      auVar60._4_4_ = fStack_31c;
      auVar60._0_4_ = local_320;
      auVar60._8_4_ = fStack_318;
      auVar60._12_4_ = fStack_314;
      auVar60._16_4_ = fStack_310;
      auVar60._20_4_ = fStack_30c;
      auVar60._24_4_ = fStack_308;
      auVar60._28_4_ = fStack_304;
      auVar94 = vmaxps_avx512vl(auVar60,auVar120);
      auVar100 = vmulps_avx512vl(auVar114,auVar124);
      auVar100 = vfmadd213ps_avx512vl(auVar113,auVar123,auVar100);
      auVar80 = vfmadd213ps_fma(auVar111,auVar122,auVar100);
      auVar100 = vmulps_avx512vl(local_600,auVar124);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_5e0,auVar123);
      auVar82 = vfmadd231ps_fma(auVar100,_local_5c0,auVar122);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar82),auVar111);
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar111,auVar122,1);
      auVar100 = vxorps_avx512vl(ZEXT1632(auVar80),auVar112);
      auVar101 = vrcp14ps_avx512vl(ZEXT1632(auVar82));
      auVar119 = ZEXT1632(auVar82);
      auVar123 = vxorps_avx512vl(auVar119,auVar112);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar113 = vfnmadd213ps_avx512vl(auVar101,auVar119,auVar124);
      auVar80 = vfmadd132ps_fma(auVar113,auVar101,auVar101);
      fVar228 = auVar80._0_4_ * auVar100._0_4_;
      fVar236 = auVar80._4_4_ * auVar100._4_4_;
      auVar34._4_4_ = fVar236;
      auVar34._0_4_ = fVar228;
      fVar237 = auVar80._8_4_ * auVar100._8_4_;
      auVar34._8_4_ = fVar237;
      fVar238 = auVar80._12_4_ * auVar100._12_4_;
      auVar34._12_4_ = fVar238;
      fVar239 = auVar100._16_4_ * 0.0;
      auVar34._16_4_ = fVar239;
      fVar255 = auVar100._20_4_ * 0.0;
      auVar34._20_4_ = fVar255;
      fVar260 = auVar100._24_4_ * 0.0;
      auVar34._24_4_ = fVar260;
      auVar34._28_4_ = auVar100._28_4_;
      uVar16 = vcmpps_avx512vl(auVar119,auVar123,1);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar34,auVar113);
      auVar125._0_4_ =
           (uint)(bVar64 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar101._0_4_;
      bVar7 = (bool)(bVar64 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar7 * auVar114._4_4_ | (uint)!bVar7 * auVar101._4_4_;
      bVar7 = (bool)(bVar64 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar7 * auVar114._8_4_ | (uint)!bVar7 * auVar101._8_4_;
      bVar7 = (bool)(bVar64 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar7 * auVar114._12_4_ | (uint)!bVar7 * auVar101._12_4_;
      bVar7 = (bool)(bVar64 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar7 * auVar114._16_4_ | (uint)!bVar7 * auVar101._16_4_;
      bVar7 = (bool)(bVar64 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar7 * auVar114._20_4_ | (uint)!bVar7 * auVar101._20_4_;
      bVar7 = (bool)(bVar64 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar7 * auVar114._24_4_ | (uint)!bVar7 * auVar101._24_4_;
      auVar125._28_4_ =
           (uint)(bVar64 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar101._28_4_;
      auVar114 = vmaxps_avx512vl(auVar94,auVar125);
      uVar16 = vcmpps_avx512vl(auVar119,auVar123,6);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126._0_4_ =
           (uint)(bVar64 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar228;
      bVar7 = (bool)(bVar64 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar7 * auVar123._4_4_ | (uint)!bVar7 * (int)fVar236;
      bVar7 = (bool)(bVar64 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar7 * auVar123._8_4_ | (uint)!bVar7 * (int)fVar237;
      bVar7 = (bool)(bVar64 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar7 * auVar123._12_4_ | (uint)!bVar7 * (int)fVar238;
      bVar7 = (bool)(bVar64 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar7 * auVar123._16_4_ | (uint)!bVar7 * (int)fVar239;
      bVar7 = (bool)(bVar64 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar7 * auVar123._20_4_ | (uint)!bVar7 * (int)fVar255;
      bVar7 = (bool)(bVar64 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar7 * auVar123._24_4_ | (uint)!bVar7 * (int)fVar260;
      auVar126._28_4_ =
           (uint)(bVar64 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar100._28_4_;
      auVar119 = vminps_avx512vl(auVar118,auVar126);
      auVar94 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar105 = ZEXT832(0) << 0x20;
      auVar101 = vsubps_avx(auVar105,auVar107);
      auVar101 = vmulps_avx512vl(auVar101,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar101,auVar109,auVar100);
      auVar94 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar94);
      auVar100 = vmulps_avx512vl(local_600,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_5e0,auVar109);
      auVar100 = vfmadd231ps_avx512vl(auVar100,_local_5c0,auVar108);
      vandps_avx512vl(auVar100,auVar111);
      uVar15 = vcmpps_avx512vl(auVar100,auVar122,1);
      auVar94 = vxorps_avx512vl(auVar94,auVar112);
      auVar101 = vrcp14ps_avx512vl(auVar100);
      auVar111 = vxorps_avx512vl(auVar100,auVar112);
      auVar265 = ZEXT3264(auVar111);
      auVar112 = vfnmadd213ps_avx512vl(auVar101,auVar100,auVar124);
      auVar80 = vfmadd132ps_fma(auVar112,auVar101,auVar101);
      fVar228 = auVar80._0_4_ * auVar94._0_4_;
      fVar236 = auVar80._4_4_ * auVar94._4_4_;
      auVar35._4_4_ = fVar236;
      auVar35._0_4_ = fVar228;
      fVar237 = auVar80._8_4_ * auVar94._8_4_;
      auVar35._8_4_ = fVar237;
      fVar238 = auVar80._12_4_ * auVar94._12_4_;
      auVar35._12_4_ = fVar238;
      fVar239 = auVar94._16_4_ * 0.0;
      auVar35._16_4_ = fVar239;
      fVar255 = auVar94._20_4_ * 0.0;
      auVar35._20_4_ = fVar255;
      fVar260 = auVar94._24_4_ * 0.0;
      auVar35._24_4_ = fVar260;
      auVar35._28_4_ = auVar94._28_4_;
      uVar16 = vcmpps_avx512vl(auVar100,auVar111,1);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar112 = vblendmps_avx512vl(auVar35,auVar113);
      auVar127._0_4_ =
           (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar101._0_4_;
      bVar7 = (bool)(bVar64 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar7 * auVar112._4_4_ | (uint)!bVar7 * auVar101._4_4_;
      bVar7 = (bool)(bVar64 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar7 * auVar112._8_4_ | (uint)!bVar7 * auVar101._8_4_;
      bVar7 = (bool)(bVar64 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar7 * auVar112._12_4_ | (uint)!bVar7 * auVar101._12_4_;
      bVar7 = (bool)(bVar64 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar7 * auVar112._16_4_ | (uint)!bVar7 * auVar101._16_4_;
      bVar7 = (bool)(bVar64 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar7 * auVar112._20_4_ | (uint)!bVar7 * auVar101._20_4_;
      bVar7 = (bool)(bVar64 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar7 * auVar112._24_4_ | (uint)!bVar7 * auVar101._24_4_;
      auVar127._28_4_ =
           (uint)(bVar64 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar101._28_4_;
      auVar263 = ZEXT3264(auVar127);
      _local_6a0 = vmaxps_avx(auVar114,auVar127);
      auVar258 = ZEXT3264(_local_6a0);
      uVar16 = vcmpps_avx512vl(auVar100,auVar111,6);
      bVar64 = (byte)uVar15 | (byte)uVar16;
      auVar128._0_4_ =
           (uint)(bVar64 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar228;
      bVar7 = (bool)(bVar64 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar7 * auVar123._4_4_ | (uint)!bVar7 * (int)fVar236;
      bVar7 = (bool)(bVar64 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar7 * auVar123._8_4_ | (uint)!bVar7 * (int)fVar237;
      bVar7 = (bool)(bVar64 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar7 * auVar123._12_4_ | (uint)!bVar7 * (int)fVar238;
      bVar7 = (bool)(bVar64 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar7 * auVar123._16_4_ | (uint)!bVar7 * (int)fVar239;
      bVar7 = (bool)(bVar64 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar7 * auVar123._20_4_ | (uint)!bVar7 * (int)fVar255;
      bVar7 = (bool)(bVar64 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar7 * auVar123._24_4_ | (uint)!bVar7 * (int)fVar260;
      auVar128._28_4_ =
           (uint)(bVar64 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar94._28_4_;
      local_380 = vminps_avx(auVar119,auVar128);
      uVar15 = vcmpps_avx512vl(_local_6a0,local_380,2);
      bVar61 = bVar61 & 0x7f & (byte)uVar15;
      if (bVar61 == 0) goto LAB_01ac22a9;
      auVar93 = vmaxps_avx(auVar105,auVar93);
      auVar94 = vfmadd213ps_avx512vl(local_8a0,auVar116,auVar99);
      fVar228 = auVar97._0_4_;
      fVar236 = auVar97._4_4_;
      auVar36._4_4_ = fVar236 * auVar94._4_4_;
      auVar36._0_4_ = fVar228 * auVar94._0_4_;
      fVar237 = auVar97._8_4_;
      auVar36._8_4_ = fVar237 * auVar94._8_4_;
      fVar238 = auVar97._12_4_;
      auVar36._12_4_ = fVar238 * auVar94._12_4_;
      fVar239 = auVar97._16_4_;
      auVar36._16_4_ = fVar239 * auVar94._16_4_;
      fVar255 = auVar97._20_4_;
      auVar36._20_4_ = fVar255 * auVar94._20_4_;
      fVar260 = auVar97._24_4_;
      auVar36._24_4_ = fVar260 * auVar94._24_4_;
      auVar36._28_4_ = auVar94._28_4_;
      auVar94 = vfmadd213ps_avx512vl(local_660,auVar116,auVar99);
      auVar37._4_4_ = fVar236 * auVar94._4_4_;
      auVar37._0_4_ = fVar228 * auVar94._0_4_;
      auVar37._8_4_ = fVar237 * auVar94._8_4_;
      auVar37._12_4_ = fVar238 * auVar94._12_4_;
      auVar37._16_4_ = fVar239 * auVar94._16_4_;
      auVar37._20_4_ = fVar255 * auVar94._20_4_;
      auVar37._24_4_ = fVar260 * auVar94._24_4_;
      auVar37._28_4_ = auVar127._28_4_;
      auVar94 = vminps_avx512vl(auVar36,auVar124);
      auVar46 = ZEXT812(0);
      auVar100 = ZEXT1232(auVar46) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar46) << 0x20);
      auVar101 = vminps_avx512vl(auVar37,auVar124);
      auVar38._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar94._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar38,auVar156,auVar233);
      auVar94 = vmaxps_avx(auVar101,ZEXT1232(auVar46) << 0x20);
      auVar39._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar94._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar39,auVar156,auVar233);
      auVar40._4_4_ = auVar93._4_4_ * auVar93._4_4_;
      auVar40._0_4_ = auVar93._0_4_ * auVar93._0_4_;
      auVar40._8_4_ = auVar93._8_4_ * auVar93._8_4_;
      auVar40._12_4_ = auVar93._12_4_ * auVar93._12_4_;
      auVar40._16_4_ = auVar93._16_4_ * auVar93._16_4_;
      auVar40._20_4_ = auVar93._20_4_ * auVar93._20_4_;
      auVar40._24_4_ = auVar93._24_4_ * auVar93._24_4_;
      auVar40._28_4_ = auVar93._28_4_;
      auVar94 = vsubps_avx(local_740,auVar40);
      auVar41._4_4_ = auVar94._4_4_ * (float)local_620._4_4_;
      auVar41._0_4_ = auVar94._0_4_ * (float)local_620._0_4_;
      auVar41._8_4_ = auVar94._8_4_ * fStack_618;
      auVar41._12_4_ = auVar94._12_4_ * fStack_614;
      auVar41._16_4_ = auVar94._16_4_ * fStack_610;
      auVar41._20_4_ = auVar94._20_4_ * fStack_60c;
      auVar41._24_4_ = auVar94._24_4_ * fStack_608;
      auVar41._28_4_ = auVar93._28_4_;
      auVar93 = vsubps_avx(local_880,auVar41);
      uVar15 = vcmpps_avx512vl(auVar93,ZEXT1232(auVar46) << 0x20,5);
      bVar64 = (byte)uVar15;
      auVar278 = ZEXT3264(local_920);
      auVar279 = ZEXT3264(local_940);
      auVar280 = ZEXT3264(local_960);
      if (bVar64 == 0) {
        bVar64 = 0;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar254 = ZEXT864(0) << 0x20;
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar263 = ZEXT864(0) << 0x20;
        auVar129._8_4_ = 0x7f800000;
        auVar129._0_8_ = 0x7f8000007f800000;
        auVar129._12_4_ = 0x7f800000;
        auVar129._16_4_ = 0x7f800000;
        auVar129._20_4_ = 0x7f800000;
        auVar129._24_4_ = 0x7f800000;
        auVar129._28_4_ = 0x7f800000;
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
      }
      else {
        auVar82 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
        uVar72 = vcmpps_avx512vl(auVar93,auVar105,5);
        auVar93 = vsqrtps_avx(auVar93);
        auVar100 = vfnmadd213ps_avx512vl(auVar115,local_840,auVar124);
        auVar111 = vfmadd132ps_avx512vl(auVar100,local_840,local_840);
        auVar100 = vsubps_avx(local_640,auVar93);
        auVar112 = vmulps_avx512vl(auVar100,auVar111);
        auVar93 = vsubps_avx512vl(auVar93,auVar117);
        auVar111 = vmulps_avx512vl(auVar93,auVar111);
        auVar93 = vfmadd213ps_avx512vl(auVar116,auVar112,auVar99);
        auVar42._4_4_ = fVar236 * auVar93._4_4_;
        auVar42._0_4_ = fVar228 * auVar93._0_4_;
        auVar42._8_4_ = fVar237 * auVar93._8_4_;
        auVar42._12_4_ = fVar238 * auVar93._12_4_;
        auVar42._16_4_ = fVar239 * auVar93._16_4_;
        auVar42._20_4_ = fVar255 * auVar93._20_4_;
        auVar42._24_4_ = fVar260 * auVar93._24_4_;
        auVar42._28_4_ = auVar101._28_4_;
        auVar43._4_4_ = (float)local_5c0._4_4_ * auVar112._4_4_;
        auVar43._0_4_ = (float)local_5c0._0_4_ * auVar112._0_4_;
        auVar43._8_4_ = fStack_5b8 * auVar112._8_4_;
        auVar43._12_4_ = fStack_5b4 * auVar112._12_4_;
        auVar43._16_4_ = fStack_5b0 * auVar112._16_4_;
        auVar43._20_4_ = fStack_5ac * auVar112._20_4_;
        auVar43._24_4_ = fStack_5a8 * auVar112._24_4_;
        auVar43._28_4_ = auVar93._28_4_;
        auVar100 = vmulps_avx512vl(local_5e0,auVar112);
        auVar105 = vmulps_avx512vl(local_600,auVar112);
        auVar93 = vfmadd213ps_avx512vl(auVar95,auVar42,auVar102);
        auVar93 = vsubps_avx512vl(auVar43,auVar93);
        auVar101 = vfmadd213ps_avx512vl(auVar96,auVar42,auVar103);
        auVar101 = vsubps_avx512vl(auVar100,auVar101);
        auVar80 = vfmadd213ps_fma(auVar42,auVar98,auVar104);
        auVar100 = vsubps_avx(auVar105,ZEXT1632(auVar80));
        auVar263 = ZEXT3264(auVar100);
        auVar99 = vfmadd213ps_avx512vl(auVar116,auVar111,auVar99);
        auVar97 = vmulps_avx512vl(auVar97,auVar99);
        auVar44._4_4_ = (float)local_5c0._4_4_ * auVar111._4_4_;
        auVar44._0_4_ = (float)local_5c0._0_4_ * auVar111._0_4_;
        auVar44._8_4_ = fStack_5b8 * auVar111._8_4_;
        auVar44._12_4_ = fStack_5b4 * auVar111._12_4_;
        auVar44._16_4_ = fStack_5b0 * auVar111._16_4_;
        auVar44._20_4_ = fStack_5ac * auVar111._20_4_;
        auVar44._24_4_ = fStack_5a8 * auVar111._24_4_;
        auVar44._28_4_ = auVar105._28_4_;
        auVar99 = vmulps_avx512vl(local_5e0,auVar111);
        auVar105 = vmulps_avx512vl(local_600,auVar111);
        auVar80 = vfmadd213ps_fma(auVar95,auVar97,auVar102);
        auVar100 = vsubps_avx(auVar44,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar96,auVar97,auVar103);
        auVar95 = vsubps_avx512vl(auVar99,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar98,auVar97,auVar104);
        auVar96 = vsubps_avx512vl(auVar105,ZEXT1632(auVar80));
        auVar254 = ZEXT3264(auVar96);
        auVar157._8_4_ = 0x7f800000;
        auVar157._0_8_ = 0x7f8000007f800000;
        auVar157._12_4_ = 0x7f800000;
        auVar157._16_4_ = 0x7f800000;
        auVar157._20_4_ = 0x7f800000;
        auVar157._24_4_ = 0x7f800000;
        auVar157._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar157,auVar112);
        bVar7 = (bool)((byte)uVar72 & 1);
        auVar129._0_4_ = (uint)bVar7 * auVar96._0_4_ | (uint)!bVar7 * auVar102._0_4_;
        bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar7 * auVar96._4_4_ | (uint)!bVar7 * auVar102._4_4_;
        bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar7 * auVar96._8_4_ | (uint)!bVar7 * auVar102._8_4_;
        bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar7 * auVar96._12_4_ | (uint)!bVar7 * auVar102._12_4_;
        bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar7 * auVar96._16_4_ | (uint)!bVar7 * auVar102._16_4_;
        bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar7 * auVar96._20_4_ | (uint)!bVar7 * auVar102._20_4_;
        bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar7 * auVar96._24_4_ | (uint)!bVar7 * auVar102._24_4_;
        bVar7 = SUB81(uVar72 >> 7,0);
        auVar129._28_4_ = (uint)bVar7 * auVar96._28_4_ | (uint)!bVar7 * auVar102._28_4_;
        auVar158._8_4_ = 0xff800000;
        auVar158._0_8_ = 0xff800000ff800000;
        auVar158._12_4_ = 0xff800000;
        auVar158._16_4_ = 0xff800000;
        auVar158._20_4_ = 0xff800000;
        auVar158._24_4_ = 0xff800000;
        auVar158._28_4_ = 0xff800000;
        auVar96 = vblendmps_avx512vl(auVar158,auVar111);
        bVar7 = (bool)((byte)uVar72 & 1);
        auVar130._0_4_ = (uint)bVar7 * auVar96._0_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar7 * auVar96._4_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar7 * auVar96._8_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar7 * auVar96._12_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar7 * auVar96._16_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar7 * auVar96._20_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar7 * auVar96._24_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = SUB81(uVar72 >> 7,0);
        auVar130._28_4_ = (uint)bVar7 * auVar96._28_4_ | (uint)!bVar7 * -0x800000;
        auVar30._8_4_ = 0x36000000;
        auVar30._0_8_ = 0x3600000036000000;
        auVar30._12_4_ = 0x36000000;
        auVar30._16_4_ = 0x36000000;
        auVar30._20_4_ = 0x36000000;
        auVar30._24_4_ = 0x36000000;
        auVar30._28_4_ = 0x36000000;
        auVar96 = vmulps_avx512vl(local_680,auVar30);
        uVar68 = vcmpps_avx512vl(auVar96,local_820,0xe);
        uVar72 = uVar72 & uVar68;
        bVar65 = (byte)uVar72;
        if (bVar65 != 0) {
          uVar68 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar82),2);
          auVar253._8_4_ = 0x7f800000;
          auVar253._0_8_ = 0x7f8000007f800000;
          auVar253._12_4_ = 0x7f800000;
          auVar253._16_4_ = 0x7f800000;
          auVar253._20_4_ = 0x7f800000;
          auVar253._24_4_ = 0x7f800000;
          auVar253._28_4_ = 0x7f800000;
          auVar269._8_4_ = 0xff800000;
          auVar269._0_8_ = 0xff800000ff800000;
          auVar269._12_4_ = 0xff800000;
          auVar269._16_4_ = 0xff800000;
          auVar269._20_4_ = 0xff800000;
          auVar269._24_4_ = 0xff800000;
          auVar269._28_4_ = 0xff800000;
          auVar94 = vblendmps_avx512vl(auVar253,auVar269);
          bVar71 = (byte)uVar68;
          uVar73 = (uint)(bVar71 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar96._0_4_;
          bVar7 = (bool)((byte)(uVar68 >> 1) & 1);
          uVar138 = (uint)bVar7 * auVar94._4_4_ | (uint)!bVar7 * auVar96._4_4_;
          bVar7 = (bool)((byte)(uVar68 >> 2) & 1);
          uVar139 = (uint)bVar7 * auVar94._8_4_ | (uint)!bVar7 * auVar96._8_4_;
          bVar7 = (bool)((byte)(uVar68 >> 3) & 1);
          uVar140 = (uint)bVar7 * auVar94._12_4_ | (uint)!bVar7 * auVar96._12_4_;
          bVar7 = (bool)((byte)(uVar68 >> 4) & 1);
          uVar141 = (uint)bVar7 * auVar94._16_4_ | (uint)!bVar7 * auVar96._16_4_;
          bVar7 = (bool)((byte)(uVar68 >> 5) & 1);
          uVar142 = (uint)bVar7 * auVar94._20_4_ | (uint)!bVar7 * auVar96._20_4_;
          bVar7 = (bool)((byte)(uVar68 >> 6) & 1);
          uVar143 = (uint)bVar7 * auVar94._24_4_ | (uint)!bVar7 * auVar96._24_4_;
          bVar7 = SUB81(uVar68 >> 7,0);
          uVar144 = (uint)bVar7 * auVar94._28_4_ | (uint)!bVar7 * auVar96._28_4_;
          auVar129._0_4_ = (bVar65 & 1) * uVar73 | !(bool)(bVar65 & 1) * auVar129._0_4_;
          bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar129._4_4_ = bVar7 * uVar138 | !bVar7 * auVar129._4_4_;
          bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar129._8_4_ = bVar7 * uVar139 | !bVar7 * auVar129._8_4_;
          bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar129._12_4_ = bVar7 * uVar140 | !bVar7 * auVar129._12_4_;
          bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar129._16_4_ = bVar7 * uVar141 | !bVar7 * auVar129._16_4_;
          bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar129._20_4_ = bVar7 * uVar142 | !bVar7 * auVar129._20_4_;
          bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar129._24_4_ = bVar7 * uVar143 | !bVar7 * auVar129._24_4_;
          bVar7 = SUB81(uVar72 >> 7,0);
          auVar129._28_4_ = bVar7 * uVar144 | !bVar7 * auVar129._28_4_;
          auVar94 = vblendmps_avx512vl(auVar269,auVar253);
          bVar7 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar68 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar68 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar68 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar68 >> 6) & 1);
          bVar14 = SUB81(uVar68 >> 7,0);
          auVar130._0_4_ =
               (uint)(bVar65 & 1) *
               ((uint)(bVar71 & 1) * auVar94._0_4_ | !(bool)(bVar71 & 1) * uVar73) |
               !(bool)(bVar65 & 1) * auVar130._0_4_;
          bVar8 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar130._4_4_ =
               (uint)bVar8 * ((uint)bVar7 * auVar94._4_4_ | !bVar7 * uVar138) |
               !bVar8 * auVar130._4_4_;
          bVar7 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar130._8_4_ =
               (uint)bVar7 * ((uint)bVar9 * auVar94._8_4_ | !bVar9 * uVar139) |
               !bVar7 * auVar130._8_4_;
          bVar7 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar130._12_4_ =
               (uint)bVar7 * ((uint)bVar10 * auVar94._12_4_ | !bVar10 * uVar140) |
               !bVar7 * auVar130._12_4_;
          bVar7 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar130._16_4_ =
               (uint)bVar7 * ((uint)bVar11 * auVar94._16_4_ | !bVar11 * uVar141) |
               !bVar7 * auVar130._16_4_;
          bVar7 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar130._20_4_ =
               (uint)bVar7 * ((uint)bVar12 * auVar94._20_4_ | !bVar12 * uVar142) |
               !bVar7 * auVar130._20_4_;
          bVar7 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar130._24_4_ =
               (uint)bVar7 * ((uint)bVar13 * auVar94._24_4_ | !bVar13 * uVar143) |
               !bVar7 * auVar130._24_4_;
          bVar7 = SUB81(uVar72 >> 7,0);
          auVar130._28_4_ =
               (uint)bVar7 * ((uint)bVar14 * auVar94._28_4_ | !bVar14 * uVar144) |
               !bVar7 * auVar130._28_4_;
          bVar64 = (~bVar65 | bVar71) & bVar64;
        }
      }
      auVar265._0_4_ = local_600._0_4_ * auVar254._0_4_;
      auVar265._4_4_ = local_600._4_4_ * auVar254._4_4_;
      auVar265._8_4_ = local_600._8_4_ * auVar254._8_4_;
      auVar265._12_4_ = local_600._12_4_ * auVar254._12_4_;
      auVar265._16_4_ = local_600._16_4_ * auVar254._16_4_;
      auVar265._20_4_ = local_600._20_4_ * auVar254._20_4_;
      auVar265._28_36_ = auVar254._28_36_;
      auVar265._24_4_ = local_600._24_4_ * auVar254._24_4_;
      auVar258 = ZEXT3264(local_5e0);
      auVar80 = vfmadd231ps_fma(auVar265._0_32_,local_5e0,auVar95);
      auVar254 = ZEXT3264(_local_5c0);
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),_local_5c0,auVar100);
      auVar265 = ZEXT3264(_local_6a0);
      _local_200 = _local_6a0;
      local_1e0 = vminps_avx(local_380,auVar129);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(ZEXT1632(auVar80),auVar249);
      auVar95 = vmaxps_avx(_local_6a0,auVar130);
      local_3a0 = auVar95;
      auVar160._8_4_ = 0x3e99999a;
      auVar160._0_8_ = 0x3e99999a3e99999a;
      auVar160._12_4_ = 0x3e99999a;
      auVar160._16_4_ = 0x3e99999a;
      auVar160._20_4_ = 0x3e99999a;
      auVar160._24_4_ = 0x3e99999a;
      auVar160._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar94,auVar160,1);
      local_5a0._0_2_ = (short)uVar15;
      uVar15 = vcmpps_avx512vl(_local_6a0,local_1e0,2);
      bVar65 = (byte)uVar15 & bVar61;
      uVar16 = vcmpps_avx512vl(auVar95,local_380,2);
      auVar275 = ZEXT3264(local_8c0);
      auVar276 = ZEXT3264(local_8e0);
      auVar277 = ZEXT3264(local_900);
      if ((bVar61 & ((byte)uVar16 | (byte)uVar15)) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar281 = ZEXT3264(auVar93);
      }
      else {
        auVar45._4_4_ = local_600._4_4_ * auVar263._4_4_;
        auVar45._0_4_ = local_600._0_4_ * auVar263._0_4_;
        auVar45._8_4_ = local_600._8_4_ * auVar263._8_4_;
        auVar45._12_4_ = local_600._12_4_ * auVar263._12_4_;
        auVar45._16_4_ = local_600._16_4_ * auVar263._16_4_;
        auVar45._20_4_ = local_600._20_4_ * auVar263._20_4_;
        auVar45._24_4_ = local_600._24_4_ * auVar263._24_4_;
        auVar45._28_4_ = 0x3e99999a;
        auVar80 = vfmadd213ps_fma(auVar101,local_5e0,auVar45);
        auVar80 = vfmadd213ps_fma(auVar93,_local_5c0,ZEXT1632(auVar80));
        auVar93 = vandps_avx(ZEXT1632(auVar80),auVar249);
        uVar15 = vcmpps_avx512vl(auVar93,auVar160,1);
        bVar71 = (byte)uVar15 | ~bVar64;
        auVar161._8_4_ = 2;
        auVar161._0_8_ = 0x200000002;
        auVar161._12_4_ = 2;
        auVar161._16_4_ = 2;
        auVar161._20_4_ = 2;
        auVar161._24_4_ = 2;
        auVar161._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar161,auVar31);
        local_340._0_4_ = (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * 2;
        bVar7 = (bool)(bVar71 >> 1 & 1);
        local_340._4_4_ = (uint)bVar7 * auVar93._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar71 >> 2 & 1);
        local_340._8_4_ = (uint)bVar7 * auVar93._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar71 >> 3 & 1);
        local_340._12_4_ = (uint)bVar7 * auVar93._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar71 >> 4 & 1);
        local_340._16_4_ = (uint)bVar7 * auVar93._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar71 >> 5 & 1);
        local_340._20_4_ = (uint)bVar7 * auVar93._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar71 >> 6 & 1);
        local_340._24_4_ = (uint)bVar7 * auVar93._24_4_ | (uint)!bVar7 * 2;
        local_340._28_4_ = (uint)(bVar71 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar71 >> 7) * 2;
        local_520 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_520,local_340,5);
        bVar71 = (byte)uVar15 & bVar65;
        if (bVar71 == 0) {
          auVar163._4_4_ = uVar74;
          auVar163._0_4_ = uVar74;
          auVar163._8_4_ = uVar74;
          auVar163._12_4_ = uVar74;
          auVar163._16_4_ = uVar74;
          auVar163._20_4_ = uVar74;
          auVar163._24_4_ = uVar74;
          auVar163._28_4_ = uVar74;
        }
        else {
          local_360 = auVar95;
          auVar82 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar80 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar88 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar81 = vminps_avx(auVar82,auVar88);
          auVar82 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar88 = vmaxps_avx(auVar80,auVar82);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar81,auVar186);
          auVar82 = vandps_avx(auVar88,auVar186);
          auVar80 = vmaxps_avx(auVar80,auVar82);
          auVar82 = vmovshdup_avx(auVar80);
          auVar82 = vmaxss_avx(auVar82,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar82);
          fVar203 = auVar80._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar88,auVar88,0xff);
          local_580 = (float)local_6a0._0_4_ + (float)local_7e0._0_4_;
          fStack_57c = (float)local_6a0._4_4_ + (float)local_7e0._4_4_;
          fStack_578 = fStack_698 + fStack_7d8;
          fStack_574 = fStack_694 + fStack_7d4;
          fStack_570 = fStack_690 + fStack_7d0;
          fStack_56c = fStack_68c + fStack_7cc;
          fStack_568 = fStack_688 + fStack_7c8;
          fStack_564 = fStack_684 + fStack_7c4;
          do {
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar162,_local_6a0);
            auVar132._0_4_ =
                 (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar71 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar7 * auVar93._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar71 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar7 * auVar93._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar71 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar7 * auVar93._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar71 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar7 * auVar93._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar71 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar7 * auVar93._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar71 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar93 = vminps_avx(auVar132,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar15 = vcmpps_avx512vl(auVar132,auVar93,0);
            bVar62 = (byte)uVar15 & bVar71;
            bVar63 = bVar71;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar18 = 0;
            for (uVar74 = (uint)bVar63; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            uVar74 = *(uint *)(local_1a0 + (uint)(iVar18 << 2));
            uVar73 = *(uint *)(local_200 + (uint)(iVar18 << 2));
            fVar222 = auVar77._0_4_;
            if ((float)local_800._0_4_ < 0.0) {
              fVar222 = sqrtf((float)local_800._0_4_);
            }
            auVar80 = vinsertps_avx(ZEXT416(uVar73),ZEXT416(uVar74),0x10);
            lVar70 = 5;
            do {
              uVar166 = auVar80._0_4_;
              auVar148._4_4_ = uVar166;
              auVar148._0_4_ = uVar166;
              auVar148._8_4_ = uVar166;
              auVar148._12_4_ = uVar166;
              auVar82 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_7f0);
              auVar88 = vmovshdup_avx(auVar80);
              fVar228 = auVar88._0_4_;
              fVar227 = 1.0 - fVar228;
              fVar223 = fVar228 * fVar228;
              auVar86 = SUB6416(ZEXT464(0x40400000),0);
              auVar85 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar83 = vfmadd213ss_fma(auVar86,auVar88,auVar85);
              auVar81 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar223),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar227),auVar85);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar227 * fVar227)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar224 = fVar227 * fVar227 * -fVar228 * 0.5;
              fVar225 = auVar81._0_4_ * 0.5;
              fVar145 = auVar84._0_4_ * 0.5;
              fVar226 = fVar228 * fVar228 * -fVar227 * 0.5;
              auVar206._0_4_ = fVar226 * (float)local_7c0._0_4_;
              auVar206._4_4_ = fVar226 * (float)local_7c0._4_4_;
              auVar206._8_4_ = fVar226 * fStack_7b8;
              auVar206._12_4_ = fVar226 * fStack_7b4;
              auVar231._4_4_ = fVar145;
              auVar231._0_4_ = fVar145;
              auVar231._8_4_ = fVar145;
              auVar231._12_4_ = fVar145;
              auVar81 = vfmadd132ps_fma(auVar231,auVar206,local_780._0_16_);
              auVar187._4_4_ = fVar225;
              auVar187._0_4_ = fVar225;
              auVar187._8_4_ = fVar225;
              auVar187._12_4_ = fVar225;
              auVar81 = vfmadd132ps_fma(auVar187,auVar81,local_7a0._0_16_);
              auVar207._4_4_ = fVar224;
              auVar207._0_4_ = fVar224;
              auVar207._8_4_ = fVar224;
              auVar207._12_4_ = fVar224;
              auVar81 = vfmadd132ps_fma(auVar207,auVar81,local_760._0_16_);
              auVar84 = vfmadd231ss_fma(auVar85,auVar88,ZEXT416(0x41100000));
              local_640._0_16_ = auVar84;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar88,ZEXT416(0x40800000));
              local_660._0_16_ = auVar84;
              auVar84 = vfmadd213ss_fma(auVar86,auVar88,ZEXT416(0xbf800000));
              local_680._0_16_ = auVar84;
              _local_620 = auVar81;
              auVar81 = vsubps_avx(auVar82,auVar81);
              auVar82 = vdpps_avx(auVar81,auVar81,0x7f);
              fVar224 = auVar82._0_4_;
              local_740 = ZEXT1632(auVar80);
              if (fVar224 < 0.0) {
                local_880._0_4_ = auVar83._0_4_;
                local_8a0._0_16_ = ZEXT416((uint)fVar227);
                local_820._0_4_ = fVar223;
                local_840._0_4_ = fVar227 * -2.0;
                auVar258._0_4_ = sqrtf(fVar224);
                auVar258._4_60_ = extraout_var;
                auVar83 = ZEXT416((uint)local_880._0_4_);
                auVar80 = auVar258._0_16_;
                auVar84 = local_8a0._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar82,auVar82);
                local_840._0_4_ = fVar227 * -2.0;
                local_820._0_4_ = fVar223;
                auVar84 = ZEXT416((uint)fVar227);
              }
              fVar223 = auVar84._0_4_;
              auVar86 = vfnmadd231ss_fma(ZEXT416((uint)(fVar228 * (fVar223 + fVar223))),auVar84,
                                         auVar84);
              auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar228 + fVar228)),
                                        ZEXT416((uint)(fVar228 * fVar228 * 3.0)));
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223 * -3.0)),
                                        ZEXT416((uint)(fVar223 + fVar223)),auVar84);
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar88,
                                        ZEXT416((uint)local_820._0_4_));
              fVar223 = auVar86._0_4_ * 0.5;
              fVar225 = auVar83._0_4_ * 0.5;
              fVar145 = auVar85._0_4_ * 0.5;
              fVar226 = auVar84._0_4_ * 0.5;
              auVar208._0_4_ = fVar226 * (float)local_7c0._0_4_;
              auVar208._4_4_ = fVar226 * (float)local_7c0._4_4_;
              auVar208._8_4_ = fVar226 * fStack_7b8;
              auVar208._12_4_ = fVar226 * fStack_7b4;
              auVar188._4_4_ = fVar145;
              auVar188._0_4_ = fVar145;
              auVar188._8_4_ = fVar145;
              auVar188._12_4_ = fVar145;
              auVar83 = vfmadd132ps_fma(auVar188,auVar208,local_780._0_16_);
              auVar170._4_4_ = fVar225;
              auVar170._0_4_ = fVar225;
              auVar170._8_4_ = fVar225;
              auVar170._12_4_ = fVar225;
              auVar83 = vfmadd132ps_fma(auVar170,auVar83,local_7a0._0_16_);
              auVar267._4_4_ = fVar223;
              auVar267._0_4_ = fVar223;
              auVar267._8_4_ = fVar223;
              auVar267._12_4_ = fVar223;
              local_880._0_16_ = vfmadd132ps_fma(auVar267,auVar83,local_760._0_16_);
              local_820._0_16_ = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
              auVar47._12_4_ = 0;
              auVar47._0_12_ = ZEXT812(0);
              fVar223 = local_820._0_4_;
              auVar83 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar223));
              fVar225 = auVar83._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar223));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(local_820._0_16_,auVar20);
              auVar83 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_860._0_4_ = auVar83._0_4_;
              local_8a0._0_4_ = auVar80._0_4_;
              if (fVar223 < auVar84._0_4_) {
                fVar145 = sqrtf(fVar223);
                auVar80 = ZEXT416((uint)local_8a0._0_4_);
                auVar83 = local_880._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar145 = auVar83._0_4_;
                auVar83 = local_880._0_16_;
              }
              fVar223 = fVar225 * 1.5 + fVar223 * -0.5 * fVar225 * fVar225 * fVar225;
              auVar149._0_4_ = auVar83._0_4_ * fVar223;
              auVar149._4_4_ = auVar83._4_4_ * fVar223;
              auVar149._8_4_ = auVar83._8_4_ * fVar223;
              auVar149._12_4_ = auVar83._12_4_ * fVar223;
              auVar84 = vdpps_avx(auVar81,auVar149,0x7f);
              fVar227 = auVar80._0_4_;
              fVar225 = auVar84._0_4_;
              auVar150._0_4_ = fVar225 * fVar225;
              auVar150._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar150._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar150._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar85 = vsubps_avx512vl(auVar82,auVar150);
              fVar226 = auVar85._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar226;
              auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar78 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              if (fVar226 < 0.0) {
                local_6d0 = fVar223;
                fStack_6cc = fVar223;
                fStack_6c8 = fVar223;
                fStack_6c4 = fVar223;
                local_6c0 = auVar86;
                fVar226 = sqrtf(fVar226);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar80 = ZEXT416((uint)local_8a0._0_4_);
                auVar85 = local_6c0;
                auVar83 = local_880._0_16_;
                fVar223 = local_6d0;
                fVar228 = fStack_6cc;
                fVar236 = fStack_6c8;
                fVar237 = fStack_6c4;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar226 = auVar85._0_4_;
                auVar85 = auVar86;
                fVar228 = fVar223;
                fVar236 = fVar223;
                fVar237 = fVar223;
              }
              auVar263 = ZEXT1664(auVar81);
              auVar275 = ZEXT3264(local_8c0);
              auVar276 = ZEXT3264(local_8e0);
              auVar277 = ZEXT3264(local_900);
              auVar278 = ZEXT3264(local_920);
              auVar279 = ZEXT3264(local_940);
              auVar280 = ZEXT3264(local_960);
              auVar172._0_4_ = (float)local_680._0_4_ * (float)local_7c0._0_4_;
              auVar172._4_4_ = (float)local_680._0_4_ * (float)local_7c0._4_4_;
              auVar172._8_4_ = (float)local_680._0_4_ * fStack_7b8;
              auVar172._12_4_ = (float)local_680._0_4_ * fStack_7b4;
              auVar189._4_4_ = local_660._0_4_;
              auVar189._0_4_ = local_660._0_4_;
              auVar189._8_4_ = local_660._0_4_;
              auVar189._12_4_ = local_660._0_4_;
              auVar76 = vfmadd132ps_fma(auVar189,auVar172,local_780._0_16_);
              auVar173._4_4_ = local_640._0_4_;
              auVar173._0_4_ = local_640._0_4_;
              auVar173._8_4_ = local_640._0_4_;
              auVar173._12_4_ = local_640._0_4_;
              auVar76 = vfmadd132ps_fma(auVar173,auVar76,local_7a0._0_16_);
              auVar88 = vfmadd213ss_fma(auVar88,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar166 = auVar88._0_4_;
              auVar190._4_4_ = uVar166;
              auVar190._0_4_ = uVar166;
              auVar190._8_4_ = uVar166;
              auVar190._12_4_ = uVar166;
              auVar88 = vfmadd132ps_fma(auVar190,auVar76,local_760._0_16_);
              auVar174._0_4_ = auVar88._0_4_ * (float)local_820._0_4_;
              auVar174._4_4_ = auVar88._4_4_ * (float)local_820._0_4_;
              auVar174._8_4_ = auVar88._8_4_ * (float)local_820._0_4_;
              auVar174._12_4_ = auVar88._12_4_ * (float)local_820._0_4_;
              auVar88 = vdpps_avx(auVar83,auVar88,0x7f);
              fVar238 = auVar88._0_4_;
              auVar191._0_4_ = auVar83._0_4_ * fVar238;
              auVar191._4_4_ = auVar83._4_4_ * fVar238;
              auVar191._8_4_ = auVar83._8_4_ * fVar238;
              auVar191._12_4_ = auVar83._12_4_ * fVar238;
              auVar88 = vsubps_avx(auVar174,auVar191);
              fVar238 = (float)local_860._0_4_ * (float)local_840._0_4_;
              auVar76 = vmaxss_avx(ZEXT416((uint)fVar203),
                                   ZEXT416((uint)(local_740._0_4_ * fVar222 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar133._16_16_ = local_960._16_16_;
              auVar87 = vxorps_avx512vl(auVar83,auVar21);
              auVar192._0_4_ = fVar223 * auVar88._0_4_ * fVar238;
              auVar192._4_4_ = fVar228 * auVar88._4_4_ * fVar238;
              auVar192._8_4_ = fVar236 * auVar88._8_4_ * fVar238;
              auVar192._12_4_ = fVar237 * auVar88._12_4_ * fVar238;
              auVar265 = ZEXT1664(auVar149);
              auVar88 = vdpps_avx(auVar87,auVar149,0x7f);
              auVar75 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar203),auVar76);
              auVar80 = vdpps_avx(auVar81,auVar192,0x7f);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                        ZEXT416((uint)(fVar203 / fVar145)),auVar75);
              fVar223 = auVar88._0_4_ + auVar80._0_4_;
              auVar80 = vdpps_avx(local_7f0,auVar149,0x7f);
              auVar88 = vdpps_avx(auVar81,auVar87,0x7f);
              auVar78 = vmulss_avx512f(auVar78,auVar85);
              fVar145 = auVar86._0_4_ * 1.5 + auVar78._0_4_ * auVar85._0_4_ * auVar85._0_4_;
              auVar85 = vdpps_avx(auVar81,local_7f0,0x7f);
              auVar78 = vfnmadd231ss_fma(auVar88,auVar84,ZEXT416((uint)fVar223));
              auVar85 = vfnmadd231ss_fma(auVar85,auVar84,auVar80);
              auVar88 = vpermilps_avx(_local_620,0xff);
              fVar226 = fVar226 - auVar88._0_4_;
              auVar86 = vshufps_avx(auVar83,auVar83,0xff);
              auVar88 = vfmsub213ss_fma(auVar78,ZEXT416((uint)fVar145),auVar86);
              auVar256._8_4_ = 0x80000000;
              auVar256._0_8_ = 0x8000000080000000;
              auVar256._12_4_ = 0x80000000;
              auVar258 = ZEXT1664(auVar256);
              auVar251._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar251._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar251._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar254 = ZEXT1664(auVar251);
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * fVar145));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar223),auVar85);
              auVar88 = vinsertps_avx(auVar251,auVar85,0x1c);
              auVar242._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = auVar80._8_4_ ^ 0x80000000;
              auVar242._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar85 = vinsertps_avx(ZEXT416((uint)fVar223),auVar242,0x10);
              auVar209._0_4_ = auVar78._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar80 = vdivps_avx(auVar88,auVar209);
              auVar88 = vdivps_avx(auVar85,auVar209);
              auVar210._0_4_ = fVar225 * auVar80._0_4_ + fVar226 * auVar88._0_4_;
              auVar210._4_4_ = fVar225 * auVar80._4_4_ + fVar226 * auVar88._4_4_;
              auVar210._8_4_ = fVar225 * auVar80._8_4_ + fVar226 * auVar88._8_4_;
              auVar210._12_4_ = fVar225 * auVar80._12_4_ + fVar226 * auVar88._12_4_;
              auVar80 = vsubps_avx(local_740._0_16_,auVar210);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar84,auVar22);
              if (auVar88._0_4_ < auVar75._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar76._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar23);
                if (auVar84._0_4_ < auVar88._0_4_) {
                  fVar222 = auVar80._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar222 < fVar165) ||
                     (fVar223 = *(float *)(ray + k * 4 + 0x100), fVar223 < fVar222)) break;
                  auVar88 = vmovshdup_avx(auVar80);
                  fVar225 = auVar88._0_4_;
                  if ((fVar225 < 0.0) || (1.0 < fVar225)) break;
                  auVar48._12_4_ = 0;
                  auVar48._0_12_ = ZEXT412(0);
                  auVar133._4_12_ = ZEXT412(0);
                  auVar133._0_4_ = fVar224;
                  auVar88 = vrsqrt14ss_avx512f(auVar48 << 0x20,auVar133._0_16_);
                  fVar224 = auVar88._0_4_;
                  auVar82 = vmulss_avx512f(auVar82,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar69].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar224 = fVar224 * 1.5 + auVar82._0_4_ * fVar224 * fVar224 * fVar224;
                  auVar211._0_4_ = auVar81._0_4_ * fVar224;
                  auVar211._4_4_ = auVar81._4_4_ * fVar224;
                  auVar211._8_4_ = auVar81._8_4_ * fVar224;
                  auVar211._12_4_ = auVar81._12_4_ * fVar224;
                  auVar84 = vfmadd213ps_fma(auVar86,auVar211,auVar83);
                  auVar82 = vshufps_avx(auVar211,auVar211,0xc9);
                  auVar88 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar212._0_4_ = auVar211._0_4_ * auVar88._0_4_;
                  auVar212._4_4_ = auVar211._4_4_ * auVar88._4_4_;
                  auVar212._8_4_ = auVar211._8_4_ * auVar88._8_4_;
                  auVar212._12_4_ = auVar211._12_4_ * auVar88._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar212,auVar83,auVar82);
                  auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar88 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                  auVar151._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                  auVar151._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                  auVar151._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                  auVar151._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar151,auVar82,auVar88);
                  uVar166 = auVar82._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar222;
                    uVar3 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar166;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar225;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar69;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar220._8_4_ = 1;
                  auVar220._0_8_ = 0x100000001;
                  auVar220._12_4_ = 1;
                  auVar220._16_4_ = 1;
                  auVar220._20_4_ = 1;
                  auVar220._24_4_ = 1;
                  auVar220._28_4_ = 1;
                  local_460 = vpermps_avx2(auVar220,ZEXT1632(auVar80));
                  auVar93 = vpermps_avx2(auVar220,ZEXT1632(auVar82));
                  auVar234._8_4_ = 2;
                  auVar234._0_8_ = 0x200000002;
                  auVar234._12_4_ = 2;
                  auVar234._16_4_ = 2;
                  auVar234._20_4_ = 2;
                  auVar234._24_4_ = 2;
                  auVar234._28_4_ = 2;
                  local_4a0 = vpermps_avx2(auVar234,ZEXT1632(auVar82));
                  local_4c0[0] = (RTCHitN)auVar93[0];
                  local_4c0[1] = (RTCHitN)auVar93[1];
                  local_4c0[2] = (RTCHitN)auVar93[2];
                  local_4c0[3] = (RTCHitN)auVar93[3];
                  local_4c0[4] = (RTCHitN)auVar93[4];
                  local_4c0[5] = (RTCHitN)auVar93[5];
                  local_4c0[6] = (RTCHitN)auVar93[6];
                  local_4c0[7] = (RTCHitN)auVar93[7];
                  local_4c0[8] = (RTCHitN)auVar93[8];
                  local_4c0[9] = (RTCHitN)auVar93[9];
                  local_4c0[10] = (RTCHitN)auVar93[10];
                  local_4c0[0xb] = (RTCHitN)auVar93[0xb];
                  local_4c0[0xc] = (RTCHitN)auVar93[0xc];
                  local_4c0[0xd] = (RTCHitN)auVar93[0xd];
                  local_4c0[0xe] = (RTCHitN)auVar93[0xe];
                  local_4c0[0xf] = (RTCHitN)auVar93[0xf];
                  local_4c0[0x10] = (RTCHitN)auVar93[0x10];
                  local_4c0[0x11] = (RTCHitN)auVar93[0x11];
                  local_4c0[0x12] = (RTCHitN)auVar93[0x12];
                  local_4c0[0x13] = (RTCHitN)auVar93[0x13];
                  local_4c0[0x14] = (RTCHitN)auVar93[0x14];
                  local_4c0[0x15] = (RTCHitN)auVar93[0x15];
                  local_4c0[0x16] = (RTCHitN)auVar93[0x16];
                  local_4c0[0x17] = (RTCHitN)auVar93[0x17];
                  local_4c0[0x18] = (RTCHitN)auVar93[0x18];
                  local_4c0[0x19] = (RTCHitN)auVar93[0x19];
                  local_4c0[0x1a] = (RTCHitN)auVar93[0x1a];
                  local_4c0[0x1b] = (RTCHitN)auVar93[0x1b];
                  local_4c0[0x1c] = (RTCHitN)auVar93[0x1c];
                  local_4c0[0x1d] = (RTCHitN)auVar93[0x1d];
                  local_4c0[0x1e] = (RTCHitN)auVar93[0x1e];
                  local_4c0[0x1f] = (RTCHitN)auVar93[0x1f];
                  local_480 = uVar166;
                  uStack_47c = uVar166;
                  uStack_478 = uVar166;
                  uStack_474 = uVar166;
                  uStack_470 = uVar166;
                  uStack_46c = uVar166;
                  uStack_468 = uVar166;
                  uStack_464 = uVar166;
                  local_440 = ZEXT432(0) << 0x20;
                  local_420 = local_500._0_8_;
                  uStack_418 = local_500._8_8_;
                  uStack_410 = local_500._16_8_;
                  uStack_408 = local_500._24_8_;
                  local_400 = local_4e0;
                  auVar93 = vpcmpeqd_avx2(local_4e0,local_4e0);
                  local_848[1] = auVar93;
                  *local_848 = auVar93;
                  local_3e0 = pRVar6->instID[0];
                  uStack_3dc = local_3e0;
                  uStack_3d8 = local_3e0;
                  uStack_3d4 = local_3e0;
                  uStack_3d0 = local_3e0;
                  uStack_3cc = local_3e0;
                  uStack_3c8 = local_3e0;
                  uStack_3c4 = local_3e0;
                  local_3c0 = pRVar6->instPrimID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  *(float *)(ray + k * 4 + 0x100) = fVar222;
                  local_720 = local_540;
                  local_990.valid = (int *)local_720;
                  local_990.geometryUserPtr = pGVar4->userPtr;
                  local_990.context = context->user;
                  local_990.hit = local_4c0;
                  local_990.N = 8;
                  local_990.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar254 = ZEXT1664(auVar251);
                    auVar258 = ZEXT1664(auVar256);
                    auVar263 = ZEXT1664(auVar81);
                    auVar265 = ZEXT1664(auVar149);
                    (*pGVar4->intersectionFilterN)(&local_990);
                    auVar280 = ZEXT3264(local_960);
                    auVar279 = ZEXT3264(local_940);
                    auVar278 = ZEXT3264(local_920);
                    auVar277 = ZEXT3264(local_900);
                    auVar276 = ZEXT3264(local_8e0);
                    auVar275 = ZEXT3264(local_8c0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      (*p_Var5)(&local_990);
                      auVar280 = ZEXT3264(local_960);
                      auVar279 = ZEXT3264(local_940);
                      auVar278 = ZEXT3264(local_920);
                      auVar277 = ZEXT3264(local_900);
                      auVar276 = ZEXT3264(local_8e0);
                      auVar275 = ZEXT3264(local_8c0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar72 = vptestmd_avx512vl(local_720,local_720);
                      iVar51 = *(int *)(local_990.hit + 4);
                      iVar52 = *(int *)(local_990.hit + 8);
                      iVar53 = *(int *)(local_990.hit + 0xc);
                      iVar54 = *(int *)(local_990.hit + 0x10);
                      iVar55 = *(int *)(local_990.hit + 0x14);
                      iVar56 = *(int *)(local_990.hit + 0x18);
                      iVar57 = *(int *)(local_990.hit + 0x1c);
                      bVar63 = (byte)uVar72;
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x180) =
                           (uint)(bVar63 & 1) * *(int *)local_990.hit |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_990.ray + 0x180);
                      *(uint *)(local_990.ray + 0x184) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x184);
                      *(uint *)(local_990.ray + 0x188) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x188);
                      *(uint *)(local_990.ray + 0x18c) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x18c);
                      *(uint *)(local_990.ray + 400) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 400);
                      *(uint *)(local_990.ray + 0x194) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x194);
                      *(uint *)(local_990.ray + 0x198) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x198);
                      *(uint *)(local_990.ray + 0x19c) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x19c);
                      iVar51 = *(int *)(local_990.hit + 0x24);
                      iVar52 = *(int *)(local_990.hit + 0x28);
                      iVar53 = *(int *)(local_990.hit + 0x2c);
                      iVar54 = *(int *)(local_990.hit + 0x30);
                      iVar55 = *(int *)(local_990.hit + 0x34);
                      iVar56 = *(int *)(local_990.hit + 0x38);
                      iVar57 = *(int *)(local_990.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x1a0) =
                           (uint)(bVar63 & 1) * *(int *)(local_990.hit + 0x20) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_990.ray + 0x1a0);
                      *(uint *)(local_990.ray + 0x1a4) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x1a4);
                      *(uint *)(local_990.ray + 0x1a8) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x1a8);
                      *(uint *)(local_990.ray + 0x1ac) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x1ac);
                      *(uint *)(local_990.ray + 0x1b0) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x1b0);
                      *(uint *)(local_990.ray + 0x1b4) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1b4);
                      *(uint *)(local_990.ray + 0x1b8) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1b8);
                      *(uint *)(local_990.ray + 0x1bc) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1bc);
                      iVar51 = *(int *)(local_990.hit + 0x44);
                      iVar52 = *(int *)(local_990.hit + 0x48);
                      iVar53 = *(int *)(local_990.hit + 0x4c);
                      iVar54 = *(int *)(local_990.hit + 0x50);
                      iVar55 = *(int *)(local_990.hit + 0x54);
                      iVar56 = *(int *)(local_990.hit + 0x58);
                      iVar57 = *(int *)(local_990.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x1c0) =
                           (uint)(bVar63 & 1) * *(int *)(local_990.hit + 0x40) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_990.ray + 0x1c0);
                      *(uint *)(local_990.ray + 0x1c4) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x1c4);
                      *(uint *)(local_990.ray + 0x1c8) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x1c8);
                      *(uint *)(local_990.ray + 0x1cc) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x1cc);
                      *(uint *)(local_990.ray + 0x1d0) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x1d0);
                      *(uint *)(local_990.ray + 0x1d4) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1d4);
                      *(uint *)(local_990.ray + 0x1d8) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1d8);
                      *(uint *)(local_990.ray + 0x1dc) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1dc);
                      iVar51 = *(int *)(local_990.hit + 100);
                      iVar52 = *(int *)(local_990.hit + 0x68);
                      iVar53 = *(int *)(local_990.hit + 0x6c);
                      iVar54 = *(int *)(local_990.hit + 0x70);
                      iVar55 = *(int *)(local_990.hit + 0x74);
                      iVar56 = *(int *)(local_990.hit + 0x78);
                      iVar57 = *(int *)(local_990.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x1e0) =
                           (uint)(bVar63 & 1) * *(int *)(local_990.hit + 0x60) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_990.ray + 0x1e0);
                      *(uint *)(local_990.ray + 0x1e4) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x1e4);
                      *(uint *)(local_990.ray + 0x1e8) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x1e8);
                      *(uint *)(local_990.ray + 0x1ec) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x1ec);
                      *(uint *)(local_990.ray + 0x1f0) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x1f0);
                      *(uint *)(local_990.ray + 500) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 500);
                      *(uint *)(local_990.ray + 0x1f8) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1f8);
                      *(uint *)(local_990.ray + 0x1fc) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1fc);
                      iVar51 = *(int *)(local_990.hit + 0x84);
                      iVar52 = *(int *)(local_990.hit + 0x88);
                      iVar53 = *(int *)(local_990.hit + 0x8c);
                      iVar54 = *(int *)(local_990.hit + 0x90);
                      iVar55 = *(int *)(local_990.hit + 0x94);
                      iVar56 = *(int *)(local_990.hit + 0x98);
                      iVar57 = *(int *)(local_990.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x200) =
                           (uint)(bVar63 & 1) * *(int *)(local_990.hit + 0x80) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_990.ray + 0x200);
                      *(uint *)(local_990.ray + 0x204) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x204);
                      *(uint *)(local_990.ray + 0x208) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x208);
                      *(uint *)(local_990.ray + 0x20c) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x20c);
                      *(uint *)(local_990.ray + 0x210) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x210);
                      *(uint *)(local_990.ray + 0x214) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x214);
                      *(uint *)(local_990.ray + 0x218) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x218);
                      *(uint *)(local_990.ray + 0x21c) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x21c);
                      auVar93 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xa0));
                      *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar93;
                      auVar93 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xc0));
                      *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar93;
                      auVar93 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xe0));
                      *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar93;
                      auVar93 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0x100));
                      *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar93;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar223;
                  break;
                }
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar163._4_4_ = uVar166;
            auVar163._0_4_ = uVar166;
            auVar163._8_4_ = uVar166;
            auVar163._12_4_ = uVar166;
            auVar163._16_4_ = uVar166;
            auVar163._20_4_ = uVar166;
            auVar163._24_4_ = uVar166;
            auVar163._28_4_ = uVar166;
            auVar58._4_4_ = fStack_57c;
            auVar58._0_4_ = local_580;
            auVar58._8_4_ = fStack_578;
            auVar58._12_4_ = fStack_574;
            auVar58._16_4_ = fStack_570;
            auVar58._20_4_ = fStack_56c;
            auVar58._24_4_ = fStack_568;
            auVar58._28_4_ = fStack_564;
            uVar15 = vcmpps_avx512vl(auVar163,auVar58,0xd);
            bVar71 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar71 & (byte)uVar15;
          } while (bVar71 != 0);
          auVar95 = local_360;
        }
        bVar64 = local_5a0[0] | ~bVar64;
        auVar182._0_4_ = (float)local_7e0._0_4_ + auVar95._0_4_;
        auVar182._4_4_ = (float)local_7e0._4_4_ + auVar95._4_4_;
        auVar182._8_4_ = fStack_7d8 + auVar95._8_4_;
        auVar182._12_4_ = fStack_7d4 + auVar95._12_4_;
        auVar182._16_4_ = fStack_7d0 + auVar95._16_4_;
        auVar182._20_4_ = fStack_7cc + auVar95._20_4_;
        auVar182._24_4_ = fStack_7c8 + auVar95._24_4_;
        auVar182._28_4_ = fStack_7c4 + auVar95._28_4_;
        uVar15 = vcmpps_avx512vl(auVar182,auVar163,2);
        bVar61 = (byte)uVar16 & bVar61 & (byte)uVar15;
        auVar183._8_4_ = 2;
        auVar183._0_8_ = 0x200000002;
        auVar183._12_4_ = 2;
        auVar183._16_4_ = 2;
        auVar183._20_4_ = 2;
        auVar183._24_4_ = 2;
        auVar183._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar183,auVar32);
        auVar134._0_4_ = (uint)(bVar64 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar7 = (bool)(bVar64 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar7 * auVar93._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar64 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar7 * auVar93._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar64 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar7 * auVar93._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar64 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar7 * auVar93._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar64 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar7 * auVar93._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar64 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar7 * auVar93._24_4_ | (uint)!bVar7 * 2;
        auVar134._28_4_ = (uint)(bVar64 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        uVar15 = vpcmpd_avx512vl(local_520,auVar134,5);
        bVar64 = (byte)uVar15 & bVar61;
        fVar203 = (float)local_7e0._0_4_;
        fVar222 = (float)local_7e0._4_4_;
        fVar223 = fStack_7d8;
        fVar224 = fStack_7d4;
        fVar225 = fStack_7d0;
        fVar145 = fStack_7cc;
        fVar226 = fStack_7c8;
        fVar227 = fStack_7c4;
        if (bVar64 != 0) {
          auVar82 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar80 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar88 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar81 = vminps_avx(auVar82,auVar88);
          auVar82 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar88 = vmaxps_avx(auVar80,auVar82);
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar81,auVar193);
          auVar82 = vandps_avx(auVar88,auVar193);
          auVar80 = vmaxps_avx(auVar80,auVar82);
          auVar82 = vmovshdup_avx(auVar80);
          auVar82 = vmaxss_avx(auVar82,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar82);
          fVar203 = auVar80._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar88,auVar88,0xff);
          local_580 = (float)local_7e0._0_4_ + local_3a0._0_4_;
          fStack_57c = (float)local_7e0._4_4_ + local_3a0._4_4_;
          fStack_578 = fStack_7d8 + local_3a0._8_4_;
          fStack_574 = fStack_7d4 + local_3a0._12_4_;
          fStack_570 = fStack_7d0 + local_3a0._16_4_;
          fStack_56c = fStack_7cc + local_3a0._20_4_;
          fStack_568 = fStack_7c8 + local_3a0._24_4_;
          fStack_564 = fStack_7c4 + local_3a0._28_4_;
          _local_6a0 = local_3a0;
          local_5a0 = auVar134;
          do {
            auVar164._8_4_ = 0x7f800000;
            auVar164._0_8_ = 0x7f8000007f800000;
            auVar164._12_4_ = 0x7f800000;
            auVar164._16_4_ = 0x7f800000;
            auVar164._20_4_ = 0x7f800000;
            auVar164._24_4_ = 0x7f800000;
            auVar164._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar164,_local_6a0);
            auVar135._0_4_ =
                 (uint)(bVar64 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar64 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar7 * auVar93._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar64 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar7 * auVar93._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar64 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar7 * auVar93._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar64 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar7 * auVar93._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar64 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar7 * auVar93._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar135._24_4_ =
                 (uint)(bVar64 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar93 = vminps_avx(auVar135,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar15 = vcmpps_avx512vl(auVar135,auVar93,0);
            bVar63 = (byte)uVar15 & bVar64;
            bVar71 = bVar64;
            if (bVar63 != 0) {
              bVar71 = bVar63;
            }
            iVar18 = 0;
            for (uVar74 = (uint)bVar71; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              iVar18 = iVar18 + 1;
            }
            uVar74 = *(uint *)(local_1c0 + (uint)(iVar18 << 2));
            uVar73 = *(uint *)(local_380 + (uint)(iVar18 << 2));
            fVar222 = auVar79._0_4_;
            if ((float)local_800._0_4_ < 0.0) {
              fVar222 = sqrtf((float)local_800._0_4_);
            }
            auVar80 = vinsertps_avx(ZEXT416(uVar73),ZEXT416(uVar74),0x10);
            lVar70 = 5;
            do {
              uVar166 = auVar80._0_4_;
              auVar152._4_4_ = uVar166;
              auVar152._0_4_ = uVar166;
              auVar152._8_4_ = uVar166;
              auVar152._12_4_ = uVar166;
              auVar82 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_7f0);
              auVar88 = vmovshdup_avx(auVar80);
              fVar228 = auVar88._0_4_;
              fVar227 = 1.0 - fVar228;
              fVar223 = fVar228 * fVar228;
              auVar86 = SUB6416(ZEXT464(0x40400000),0);
              auVar85 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar83 = vfmadd213ss_fma(auVar86,auVar88,auVar85);
              auVar81 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar223),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar84 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar227),auVar85);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar227 * fVar227)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar224 = fVar227 * fVar227 * -fVar228 * 0.5;
              fVar225 = auVar81._0_4_ * 0.5;
              fVar145 = auVar84._0_4_ * 0.5;
              fVar226 = fVar228 * fVar228 * -fVar227 * 0.5;
              auVar213._0_4_ = fVar226 * (float)local_7c0._0_4_;
              auVar213._4_4_ = fVar226 * (float)local_7c0._4_4_;
              auVar213._8_4_ = fVar226 * fStack_7b8;
              auVar213._12_4_ = fVar226 * fStack_7b4;
              auVar232._4_4_ = fVar145;
              auVar232._0_4_ = fVar145;
              auVar232._8_4_ = fVar145;
              auVar232._12_4_ = fVar145;
              auVar81 = vfmadd132ps_fma(auVar232,auVar213,local_780._0_16_);
              auVar194._4_4_ = fVar225;
              auVar194._0_4_ = fVar225;
              auVar194._8_4_ = fVar225;
              auVar194._12_4_ = fVar225;
              auVar81 = vfmadd132ps_fma(auVar194,auVar81,local_7a0._0_16_);
              auVar214._4_4_ = fVar224;
              auVar214._0_4_ = fVar224;
              auVar214._8_4_ = fVar224;
              auVar214._12_4_ = fVar224;
              auVar81 = vfmadd132ps_fma(auVar214,auVar81,local_760._0_16_);
              auVar84 = vfmadd231ss_fma(auVar85,auVar88,ZEXT416(0x41100000));
              local_640._0_16_ = auVar84;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar88,ZEXT416(0x40800000));
              local_660._0_16_ = auVar84;
              auVar84 = vfmadd213ss_fma(auVar86,auVar88,ZEXT416(0xbf800000));
              local_680._0_16_ = auVar84;
              _local_620 = auVar81;
              auVar81 = vsubps_avx(auVar82,auVar81);
              auVar82 = vdpps_avx(auVar81,auVar81,0x7f);
              fVar224 = auVar82._0_4_;
              local_740 = ZEXT1632(auVar80);
              if (fVar224 < 0.0) {
                local_880._0_4_ = auVar83._0_4_;
                local_8a0._0_16_ = ZEXT416((uint)fVar227);
                local_820._0_4_ = fVar223;
                local_840._0_4_ = fVar227 * -2.0;
                auVar263._0_4_ = sqrtf(fVar224);
                auVar263._4_60_ = extraout_var_00;
                auVar83 = ZEXT416((uint)local_880._0_4_);
                auVar80 = auVar263._0_16_;
                auVar84 = local_8a0._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar82,auVar82);
                local_840._0_4_ = fVar227 * -2.0;
                local_820._0_4_ = fVar223;
                auVar84 = ZEXT416((uint)fVar227);
              }
              fVar223 = auVar84._0_4_;
              auVar86 = vfnmadd231ss_fma(ZEXT416((uint)(fVar228 * (fVar223 + fVar223))),auVar84,
                                         auVar84);
              auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar228 + fVar228)),
                                        ZEXT416((uint)(fVar228 * fVar228 * 3.0)));
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar88,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223 * -3.0)),
                                        ZEXT416((uint)(fVar223 + fVar223)),auVar84);
              auVar84 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar88,
                                        ZEXT416((uint)local_820._0_4_));
              fVar223 = auVar86._0_4_ * 0.5;
              fVar225 = auVar83._0_4_ * 0.5;
              fVar145 = auVar85._0_4_ * 0.5;
              fVar226 = auVar84._0_4_ * 0.5;
              auVar215._0_4_ = fVar226 * (float)local_7c0._0_4_;
              auVar215._4_4_ = fVar226 * (float)local_7c0._4_4_;
              auVar215._8_4_ = fVar226 * fStack_7b8;
              auVar215._12_4_ = fVar226 * fStack_7b4;
              auVar195._4_4_ = fVar145;
              auVar195._0_4_ = fVar145;
              auVar195._8_4_ = fVar145;
              auVar195._12_4_ = fVar145;
              auVar83 = vfmadd132ps_fma(auVar195,auVar215,local_780._0_16_);
              auVar175._4_4_ = fVar225;
              auVar175._0_4_ = fVar225;
              auVar175._8_4_ = fVar225;
              auVar175._12_4_ = fVar225;
              auVar83 = vfmadd132ps_fma(auVar175,auVar83,local_7a0._0_16_);
              auVar268._4_4_ = fVar223;
              auVar268._0_4_ = fVar223;
              auVar268._8_4_ = fVar223;
              auVar268._12_4_ = fVar223;
              local_880._0_16_ = vfmadd132ps_fma(auVar268,auVar83,local_760._0_16_);
              local_820._0_16_ = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT812(0);
              fVar223 = local_820._0_4_;
              auVar83 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar223));
              fVar225 = auVar83._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar223));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(local_820._0_16_,auVar24);
              auVar83 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_860._0_4_ = auVar83._0_4_;
              local_8a0._0_4_ = auVar80._0_4_;
              if (fVar223 < auVar84._0_4_) {
                fVar145 = sqrtf(fVar223);
                auVar80 = ZEXT416((uint)local_8a0._0_4_);
                auVar83 = local_880._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar145 = auVar83._0_4_;
                auVar83 = local_880._0_16_;
              }
              fVar223 = fVar225 * 1.5 + fVar223 * -0.5 * fVar225 * fVar225 * fVar225;
              auVar153._0_4_ = auVar83._0_4_ * fVar223;
              auVar153._4_4_ = auVar83._4_4_ * fVar223;
              auVar153._8_4_ = auVar83._8_4_ * fVar223;
              auVar153._12_4_ = auVar83._12_4_ * fVar223;
              auVar84 = vdpps_avx(auVar81,auVar153,0x7f);
              fVar227 = auVar80._0_4_;
              fVar225 = auVar84._0_4_;
              auVar154._0_4_ = fVar225 * fVar225;
              auVar154._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar154._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar154._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar85 = vsubps_avx512vl(auVar82,auVar154);
              fVar226 = auVar85._0_4_;
              auVar176._4_12_ = ZEXT812(0) << 0x20;
              auVar176._0_4_ = fVar226;
              auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
              auVar78 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              if (fVar226 < 0.0) {
                local_6d0 = fVar223;
                fStack_6cc = fVar223;
                fStack_6c8 = fVar223;
                fStack_6c4 = fVar223;
                local_6c0 = auVar86;
                fVar226 = sqrtf(fVar226);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar80 = ZEXT416((uint)local_8a0._0_4_);
                auVar85 = local_6c0;
                auVar83 = local_880._0_16_;
                fVar223 = local_6d0;
                fVar228 = fStack_6cc;
                fVar236 = fStack_6c8;
                fVar237 = fStack_6c4;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar226 = auVar85._0_4_;
                auVar85 = auVar86;
                fVar228 = fVar223;
                fVar236 = fVar223;
                fVar237 = fVar223;
              }
              auVar263 = ZEXT1664(auVar81);
              auVar275 = ZEXT3264(local_8c0);
              auVar276 = ZEXT3264(local_8e0);
              auVar277 = ZEXT3264(local_900);
              auVar278 = ZEXT3264(local_920);
              auVar279 = ZEXT3264(local_940);
              auVar280 = ZEXT3264(local_960);
              auVar177._0_4_ = (float)local_680._0_4_ * (float)local_7c0._0_4_;
              auVar177._4_4_ = (float)local_680._0_4_ * (float)local_7c0._4_4_;
              auVar177._8_4_ = (float)local_680._0_4_ * fStack_7b8;
              auVar177._12_4_ = (float)local_680._0_4_ * fStack_7b4;
              auVar196._4_4_ = local_660._0_4_;
              auVar196._0_4_ = local_660._0_4_;
              auVar196._8_4_ = local_660._0_4_;
              auVar196._12_4_ = local_660._0_4_;
              auVar76 = vfmadd132ps_fma(auVar196,auVar177,local_780._0_16_);
              auVar178._4_4_ = local_640._0_4_;
              auVar178._0_4_ = local_640._0_4_;
              auVar178._8_4_ = local_640._0_4_;
              auVar178._12_4_ = local_640._0_4_;
              auVar76 = vfmadd132ps_fma(auVar178,auVar76,local_7a0._0_16_);
              auVar88 = vfmadd213ss_fma(auVar88,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar166 = auVar88._0_4_;
              auVar197._4_4_ = uVar166;
              auVar197._0_4_ = uVar166;
              auVar197._8_4_ = uVar166;
              auVar197._12_4_ = uVar166;
              auVar88 = vfmadd132ps_fma(auVar197,auVar76,local_760._0_16_);
              auVar179._0_4_ = auVar88._0_4_ * (float)local_820._0_4_;
              auVar179._4_4_ = auVar88._4_4_ * (float)local_820._0_4_;
              auVar179._8_4_ = auVar88._8_4_ * (float)local_820._0_4_;
              auVar179._12_4_ = auVar88._12_4_ * (float)local_820._0_4_;
              auVar88 = vdpps_avx(auVar83,auVar88,0x7f);
              fVar238 = auVar88._0_4_;
              auVar198._0_4_ = auVar83._0_4_ * fVar238;
              auVar198._4_4_ = auVar83._4_4_ * fVar238;
              auVar198._8_4_ = auVar83._8_4_ * fVar238;
              auVar198._12_4_ = auVar83._12_4_ * fVar238;
              auVar88 = vsubps_avx(auVar179,auVar198);
              fVar238 = (float)local_860._0_4_ * (float)local_840._0_4_;
              auVar76 = vmaxss_avx(ZEXT416((uint)fVar203),
                                   ZEXT416((uint)(local_740._0_4_ * fVar222 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar136._16_16_ = local_960._16_16_;
              auVar87 = vxorps_avx512vl(auVar83,auVar25);
              auVar199._0_4_ = fVar223 * auVar88._0_4_ * fVar238;
              auVar199._4_4_ = fVar228 * auVar88._4_4_ * fVar238;
              auVar199._8_4_ = fVar236 * auVar88._8_4_ * fVar238;
              auVar199._12_4_ = fVar237 * auVar88._12_4_ * fVar238;
              auVar265 = ZEXT1664(auVar153);
              auVar88 = vdpps_avx(auVar87,auVar153,0x7f);
              auVar75 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar203),auVar76);
              auVar80 = vdpps_avx(auVar81,auVar199,0x7f);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                        ZEXT416((uint)(fVar203 / fVar145)),auVar75);
              fVar223 = auVar88._0_4_ + auVar80._0_4_;
              auVar80 = vdpps_avx(local_7f0,auVar153,0x7f);
              auVar88 = vdpps_avx(auVar81,auVar87,0x7f);
              auVar78 = vmulss_avx512f(auVar78,auVar85);
              fVar145 = auVar86._0_4_ * 1.5 + auVar78._0_4_ * auVar85._0_4_ * auVar85._0_4_;
              auVar85 = vdpps_avx(auVar81,local_7f0,0x7f);
              auVar78 = vfnmadd231ss_fma(auVar88,auVar84,ZEXT416((uint)fVar223));
              auVar85 = vfnmadd231ss_fma(auVar85,auVar84,auVar80);
              auVar88 = vpermilps_avx(_local_620,0xff);
              fVar226 = fVar226 - auVar88._0_4_;
              auVar86 = vshufps_avx(auVar83,auVar83,0xff);
              auVar88 = vfmsub213ss_fma(auVar78,ZEXT416((uint)fVar145),auVar86);
              auVar257._8_4_ = 0x80000000;
              auVar257._0_8_ = 0x8000000080000000;
              auVar257._12_4_ = 0x80000000;
              auVar258 = ZEXT1664(auVar257);
              auVar252._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar252._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar252._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar254 = ZEXT1664(auVar252);
              auVar85 = ZEXT416((uint)(auVar85._0_4_ * fVar145));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar223),auVar85);
              auVar88 = vinsertps_avx(auVar252,auVar85,0x1c);
              auVar243._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar80._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar85 = vinsertps_avx(ZEXT416((uint)fVar223),auVar243,0x10);
              auVar216._0_4_ = auVar78._0_4_;
              auVar216._4_4_ = auVar216._0_4_;
              auVar216._8_4_ = auVar216._0_4_;
              auVar216._12_4_ = auVar216._0_4_;
              auVar80 = vdivps_avx(auVar88,auVar216);
              auVar88 = vdivps_avx(auVar85,auVar216);
              auVar217._0_4_ = fVar225 * auVar80._0_4_ + fVar226 * auVar88._0_4_;
              auVar217._4_4_ = fVar225 * auVar80._4_4_ + fVar226 * auVar88._4_4_;
              auVar217._8_4_ = fVar225 * auVar80._8_4_ + fVar226 * auVar88._8_4_;
              auVar217._12_4_ = fVar225 * auVar80._12_4_ + fVar226 * auVar88._12_4_;
              auVar80 = vsubps_avx(local_740._0_16_,auVar217);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar88 = vandps_avx512vl(auVar84,auVar26);
              if (auVar88._0_4_ < auVar75._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar76._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar27);
                if (auVar84._0_4_ < auVar88._0_4_) {
                  fVar222 = auVar80._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar222 < fVar165) ||
                     (fVar223 = *(float *)(ray + k * 4 + 0x100), fVar223 < fVar222)) break;
                  auVar88 = vmovshdup_avx(auVar80);
                  fVar225 = auVar88._0_4_;
                  if ((fVar225 < 0.0) || (1.0 < fVar225)) break;
                  auVar50._12_4_ = 0;
                  auVar50._0_12_ = ZEXT412(0);
                  auVar136._4_12_ = ZEXT412(0);
                  auVar136._0_4_ = fVar224;
                  auVar88 = vrsqrt14ss_avx512f(auVar50 << 0x20,auVar136._0_16_);
                  fVar224 = auVar88._0_4_;
                  auVar82 = vmulss_avx512f(auVar82,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar69].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar224 = fVar224 * 1.5 + auVar82._0_4_ * fVar224 * fVar224 * fVar224;
                  auVar218._0_4_ = auVar81._0_4_ * fVar224;
                  auVar218._4_4_ = auVar81._4_4_ * fVar224;
                  auVar218._8_4_ = auVar81._8_4_ * fVar224;
                  auVar218._12_4_ = auVar81._12_4_ * fVar224;
                  auVar84 = vfmadd213ps_fma(auVar86,auVar218,auVar83);
                  auVar82 = vshufps_avx(auVar218,auVar218,0xc9);
                  auVar88 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar219._0_4_ = auVar218._0_4_ * auVar88._0_4_;
                  auVar219._4_4_ = auVar218._4_4_ * auVar88._4_4_;
                  auVar219._8_4_ = auVar218._8_4_ * auVar88._8_4_;
                  auVar219._12_4_ = auVar218._12_4_ * auVar88._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar219,auVar83,auVar82);
                  auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar88 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                  auVar155._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                  auVar155._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                  auVar155._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                  auVar155._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar155,auVar82,auVar88);
                  uVar166 = auVar82._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar222;
                    uVar3 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar166;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar225;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar69;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar6 = context->user;
                  auVar221._8_4_ = 1;
                  auVar221._0_8_ = 0x100000001;
                  auVar221._12_4_ = 1;
                  auVar221._16_4_ = 1;
                  auVar221._20_4_ = 1;
                  auVar221._24_4_ = 1;
                  auVar221._28_4_ = 1;
                  local_460 = vpermps_avx2(auVar221,ZEXT1632(auVar80));
                  auVar93 = vpermps_avx2(auVar221,ZEXT1632(auVar82));
                  auVar235._8_4_ = 2;
                  auVar235._0_8_ = 0x200000002;
                  auVar235._12_4_ = 2;
                  auVar235._16_4_ = 2;
                  auVar235._20_4_ = 2;
                  auVar235._24_4_ = 2;
                  auVar235._28_4_ = 2;
                  local_4a0 = vpermps_avx2(auVar235,ZEXT1632(auVar82));
                  local_4c0[0] = (RTCHitN)auVar93[0];
                  local_4c0[1] = (RTCHitN)auVar93[1];
                  local_4c0[2] = (RTCHitN)auVar93[2];
                  local_4c0[3] = (RTCHitN)auVar93[3];
                  local_4c0[4] = (RTCHitN)auVar93[4];
                  local_4c0[5] = (RTCHitN)auVar93[5];
                  local_4c0[6] = (RTCHitN)auVar93[6];
                  local_4c0[7] = (RTCHitN)auVar93[7];
                  local_4c0[8] = (RTCHitN)auVar93[8];
                  local_4c0[9] = (RTCHitN)auVar93[9];
                  local_4c0[10] = (RTCHitN)auVar93[10];
                  local_4c0[0xb] = (RTCHitN)auVar93[0xb];
                  local_4c0[0xc] = (RTCHitN)auVar93[0xc];
                  local_4c0[0xd] = (RTCHitN)auVar93[0xd];
                  local_4c0[0xe] = (RTCHitN)auVar93[0xe];
                  local_4c0[0xf] = (RTCHitN)auVar93[0xf];
                  local_4c0[0x10] = (RTCHitN)auVar93[0x10];
                  local_4c0[0x11] = (RTCHitN)auVar93[0x11];
                  local_4c0[0x12] = (RTCHitN)auVar93[0x12];
                  local_4c0[0x13] = (RTCHitN)auVar93[0x13];
                  local_4c0[0x14] = (RTCHitN)auVar93[0x14];
                  local_4c0[0x15] = (RTCHitN)auVar93[0x15];
                  local_4c0[0x16] = (RTCHitN)auVar93[0x16];
                  local_4c0[0x17] = (RTCHitN)auVar93[0x17];
                  local_4c0[0x18] = (RTCHitN)auVar93[0x18];
                  local_4c0[0x19] = (RTCHitN)auVar93[0x19];
                  local_4c0[0x1a] = (RTCHitN)auVar93[0x1a];
                  local_4c0[0x1b] = (RTCHitN)auVar93[0x1b];
                  local_4c0[0x1c] = (RTCHitN)auVar93[0x1c];
                  local_4c0[0x1d] = (RTCHitN)auVar93[0x1d];
                  local_4c0[0x1e] = (RTCHitN)auVar93[0x1e];
                  local_4c0[0x1f] = (RTCHitN)auVar93[0x1f];
                  local_480 = uVar166;
                  uStack_47c = uVar166;
                  uStack_478 = uVar166;
                  uStack_474 = uVar166;
                  uStack_470 = uVar166;
                  uStack_46c = uVar166;
                  uStack_468 = uVar166;
                  uStack_464 = uVar166;
                  local_440 = ZEXT432(0) << 0x20;
                  local_420 = local_500._0_8_;
                  uStack_418 = local_500._8_8_;
                  uStack_410 = local_500._16_8_;
                  uStack_408 = local_500._24_8_;
                  local_400 = local_4e0;
                  auVar93 = vpcmpeqd_avx2(local_4e0,local_4e0);
                  local_848[1] = auVar93;
                  *local_848 = auVar93;
                  local_3e0 = pRVar6->instID[0];
                  uStack_3dc = local_3e0;
                  uStack_3d8 = local_3e0;
                  uStack_3d4 = local_3e0;
                  uStack_3d0 = local_3e0;
                  uStack_3cc = local_3e0;
                  uStack_3c8 = local_3e0;
                  uStack_3c4 = local_3e0;
                  local_3c0 = pRVar6->instPrimID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  *(float *)(ray + k * 4 + 0x100) = fVar222;
                  local_720 = local_540;
                  local_990.valid = (int *)local_720;
                  local_990.geometryUserPtr = pGVar4->userPtr;
                  local_990.context = context->user;
                  local_990.hit = local_4c0;
                  local_990.N = 8;
                  local_990.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar254 = ZEXT1664(auVar252);
                    auVar258 = ZEXT1664(auVar257);
                    auVar263 = ZEXT1664(auVar81);
                    auVar265 = ZEXT1664(auVar153);
                    (*pGVar4->intersectionFilterN)(&local_990);
                    auVar280 = ZEXT3264(local_960);
                    auVar279 = ZEXT3264(local_940);
                    auVar278 = ZEXT3264(local_920);
                    auVar277 = ZEXT3264(local_900);
                    auVar276 = ZEXT3264(local_8e0);
                    auVar275 = ZEXT3264(local_8c0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      (*p_Var5)(&local_990);
                      auVar280 = ZEXT3264(local_960);
                      auVar279 = ZEXT3264(local_940);
                      auVar278 = ZEXT3264(local_920);
                      auVar277 = ZEXT3264(local_900);
                      auVar276 = ZEXT3264(local_8e0);
                      auVar275 = ZEXT3264(local_8c0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar72 = vptestmd_avx512vl(local_720,local_720);
                      iVar51 = *(int *)(local_990.hit + 4);
                      iVar52 = *(int *)(local_990.hit + 8);
                      iVar53 = *(int *)(local_990.hit + 0xc);
                      iVar54 = *(int *)(local_990.hit + 0x10);
                      iVar55 = *(int *)(local_990.hit + 0x14);
                      iVar56 = *(int *)(local_990.hit + 0x18);
                      iVar57 = *(int *)(local_990.hit + 0x1c);
                      bVar71 = (byte)uVar72;
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x180) =
                           (uint)(bVar71 & 1) * *(int *)local_990.hit |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_990.ray + 0x180);
                      *(uint *)(local_990.ray + 0x184) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x184);
                      *(uint *)(local_990.ray + 0x188) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x188);
                      *(uint *)(local_990.ray + 0x18c) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x18c);
                      *(uint *)(local_990.ray + 400) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 400);
                      *(uint *)(local_990.ray + 0x194) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x194);
                      *(uint *)(local_990.ray + 0x198) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x198);
                      *(uint *)(local_990.ray + 0x19c) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x19c);
                      iVar51 = *(int *)(local_990.hit + 0x24);
                      iVar52 = *(int *)(local_990.hit + 0x28);
                      iVar53 = *(int *)(local_990.hit + 0x2c);
                      iVar54 = *(int *)(local_990.hit + 0x30);
                      iVar55 = *(int *)(local_990.hit + 0x34);
                      iVar56 = *(int *)(local_990.hit + 0x38);
                      iVar57 = *(int *)(local_990.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x1a0) =
                           (uint)(bVar71 & 1) * *(int *)(local_990.hit + 0x20) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_990.ray + 0x1a0);
                      *(uint *)(local_990.ray + 0x1a4) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x1a4);
                      *(uint *)(local_990.ray + 0x1a8) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x1a8);
                      *(uint *)(local_990.ray + 0x1ac) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x1ac);
                      *(uint *)(local_990.ray + 0x1b0) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x1b0);
                      *(uint *)(local_990.ray + 0x1b4) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1b4);
                      *(uint *)(local_990.ray + 0x1b8) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1b8);
                      *(uint *)(local_990.ray + 0x1bc) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1bc);
                      iVar51 = *(int *)(local_990.hit + 0x44);
                      iVar52 = *(int *)(local_990.hit + 0x48);
                      iVar53 = *(int *)(local_990.hit + 0x4c);
                      iVar54 = *(int *)(local_990.hit + 0x50);
                      iVar55 = *(int *)(local_990.hit + 0x54);
                      iVar56 = *(int *)(local_990.hit + 0x58);
                      iVar57 = *(int *)(local_990.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x1c0) =
                           (uint)(bVar71 & 1) * *(int *)(local_990.hit + 0x40) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_990.ray + 0x1c0);
                      *(uint *)(local_990.ray + 0x1c4) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x1c4);
                      *(uint *)(local_990.ray + 0x1c8) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x1c8);
                      *(uint *)(local_990.ray + 0x1cc) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x1cc);
                      *(uint *)(local_990.ray + 0x1d0) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x1d0);
                      *(uint *)(local_990.ray + 0x1d4) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x1d4);
                      *(uint *)(local_990.ray + 0x1d8) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1d8);
                      *(uint *)(local_990.ray + 0x1dc) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1dc);
                      iVar51 = *(int *)(local_990.hit + 100);
                      iVar52 = *(int *)(local_990.hit + 0x68);
                      iVar53 = *(int *)(local_990.hit + 0x6c);
                      iVar54 = *(int *)(local_990.hit + 0x70);
                      iVar55 = *(int *)(local_990.hit + 0x74);
                      iVar56 = *(int *)(local_990.hit + 0x78);
                      iVar57 = *(int *)(local_990.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x1e0) =
                           (uint)(bVar71 & 1) * *(int *)(local_990.hit + 0x60) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_990.ray + 0x1e0);
                      *(uint *)(local_990.ray + 0x1e4) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x1e4);
                      *(uint *)(local_990.ray + 0x1e8) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x1e8);
                      *(uint *)(local_990.ray + 0x1ec) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x1ec);
                      *(uint *)(local_990.ray + 0x1f0) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x1f0);
                      *(uint *)(local_990.ray + 500) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 500);
                      *(uint *)(local_990.ray + 0x1f8) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x1f8);
                      *(uint *)(local_990.ray + 0x1fc) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x1fc);
                      iVar51 = *(int *)(local_990.hit + 0x84);
                      iVar52 = *(int *)(local_990.hit + 0x88);
                      iVar53 = *(int *)(local_990.hit + 0x8c);
                      iVar54 = *(int *)(local_990.hit + 0x90);
                      iVar55 = *(int *)(local_990.hit + 0x94);
                      iVar56 = *(int *)(local_990.hit + 0x98);
                      iVar57 = *(int *)(local_990.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar72 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar72 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar72 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar72 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar72 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                      bVar13 = SUB81(uVar72 >> 7,0);
                      *(uint *)(local_990.ray + 0x200) =
                           (uint)(bVar71 & 1) * *(int *)(local_990.hit + 0x80) |
                           (uint)!(bool)(bVar71 & 1) * *(int *)(local_990.ray + 0x200);
                      *(uint *)(local_990.ray + 0x204) =
                           (uint)bVar7 * iVar51 | (uint)!bVar7 * *(int *)(local_990.ray + 0x204);
                      *(uint *)(local_990.ray + 0x208) =
                           (uint)bVar8 * iVar52 | (uint)!bVar8 * *(int *)(local_990.ray + 0x208);
                      *(uint *)(local_990.ray + 0x20c) =
                           (uint)bVar9 * iVar53 | (uint)!bVar9 * *(int *)(local_990.ray + 0x20c);
                      *(uint *)(local_990.ray + 0x210) =
                           (uint)bVar10 * iVar54 | (uint)!bVar10 * *(int *)(local_990.ray + 0x210);
                      *(uint *)(local_990.ray + 0x214) =
                           (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_990.ray + 0x214);
                      *(uint *)(local_990.ray + 0x218) =
                           (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_990.ray + 0x218);
                      *(uint *)(local_990.ray + 0x21c) =
                           (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_990.ray + 0x21c);
                      auVar93 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xa0));
                      *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar93;
                      auVar93 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xc0));
                      *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar93;
                      auVar93 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0xe0));
                      *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar93;
                      auVar93 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_990.hit + 0x100));
                      *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar93;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar223;
                  break;
                }
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar163._4_4_ = uVar166;
            auVar163._0_4_ = uVar166;
            auVar163._8_4_ = uVar166;
            auVar163._12_4_ = uVar166;
            auVar163._16_4_ = uVar166;
            auVar163._20_4_ = uVar166;
            auVar163._24_4_ = uVar166;
            auVar163._28_4_ = uVar166;
            auVar59._4_4_ = fStack_57c;
            auVar59._0_4_ = local_580;
            auVar59._8_4_ = fStack_578;
            auVar59._12_4_ = fStack_574;
            auVar59._16_4_ = fStack_570;
            auVar59._20_4_ = fStack_56c;
            auVar59._24_4_ = fStack_568;
            auVar59._28_4_ = fStack_564;
            uVar15 = vcmpps_avx512vl(auVar163,auVar59,0xd);
            bVar64 = ~('\x01' << ((byte)iVar18 & 0x1f)) & bVar64 & (byte)uVar15;
          } while (bVar64 != 0);
          auVar134 = local_5a0;
          fVar203 = (float)local_7e0._0_4_;
          fVar222 = (float)local_7e0._4_4_;
          fVar223 = fStack_7d8;
          fVar224 = fStack_7d4;
          fVar225 = fStack_7d0;
          fVar145 = fStack_7cc;
          fVar226 = fStack_7c8;
          fVar227 = fStack_7c4;
        }
        uVar16 = vpcmpgtd_avx512vl(auVar134,local_520);
        uVar17 = vpcmpd_avx512vl(local_520,local_340,1);
        auVar201._0_4_ = fVar203 + (float)local_200._0_4_;
        auVar201._4_4_ = fVar222 + (float)local_200._4_4_;
        auVar201._8_4_ = fVar223 + fStack_1f8;
        auVar201._12_4_ = fVar224 + fStack_1f4;
        auVar201._16_4_ = fVar225 + fStack_1f0;
        auVar201._20_4_ = fVar145 + fStack_1ec;
        auVar201._24_4_ = fVar226 + fStack_1e8;
        auVar201._28_4_ = fVar227 + fStack_1e4;
        uVar15 = vcmpps_avx512vl(auVar201,auVar163,2);
        bVar65 = bVar65 & (byte)uVar17 & (byte)uVar15;
        auVar202._0_4_ = fVar203 + local_3a0._0_4_;
        auVar202._4_4_ = fVar222 + local_3a0._4_4_;
        auVar202._8_4_ = fVar223 + local_3a0._8_4_;
        auVar202._12_4_ = fVar224 + local_3a0._12_4_;
        auVar202._16_4_ = fVar225 + local_3a0._16_4_;
        auVar202._20_4_ = fVar145 + local_3a0._20_4_;
        auVar202._24_4_ = fVar226 + local_3a0._24_4_;
        auVar202._28_4_ = fVar227 + local_3a0._28_4_;
        uVar15 = vcmpps_avx512vl(auVar202,auVar163,2);
        bVar61 = bVar61 & (byte)uVar16 & (byte)uVar15 | bVar65;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar281 = ZEXT3264(auVar93);
        prim = local_6b0;
        if (bVar61 != 0) {
          abStack_180[uVar66 * 0x60] = bVar61;
          auVar137._0_4_ =
               (uint)(bVar65 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar65 & 1) * (int)local_3a0._0_4_;
          bVar7 = (bool)(bVar65 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar7 * local_200._4_4_ | (uint)!bVar7 * (int)local_3a0._4_4_;
          bVar7 = (bool)(bVar65 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)local_3a0._8_4_;
          bVar7 = (bool)(bVar65 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar7 * (int)fStack_1f4 | (uint)!bVar7 * (int)local_3a0._12_4_;
          bVar7 = (bool)(bVar65 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar7 * (int)fStack_1f0 | (uint)!bVar7 * (int)local_3a0._16_4_;
          bVar7 = (bool)(bVar65 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar7 * (int)fStack_1ec | (uint)!bVar7 * (int)local_3a0._20_4_;
          auVar137._24_4_ =
               (uint)(bVar65 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar65 >> 6) * (int)local_3a0._24_4_;
          auVar137._28_4_ = local_3a0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar137;
          uVar72 = vmovlps_avx(local_550);
          (&uStack_140)[uVar66 * 0xc] = uVar72;
          aiStack_138[uVar66 * 0x18] = iVar67 + 1;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
      }
    }
    do {
      uVar74 = (uint)uVar66;
      uVar66 = (ulong)(uVar74 - 1);
      if (uVar74 == 0) {
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar166;
        auVar28._0_4_ = uVar166;
        auVar28._8_4_ = uVar166;
        auVar28._12_4_ = uVar166;
        uVar15 = vcmpps_avx512vl(local_560,auVar28,2);
        uVar69 = (uint)local_6a8 & (uint)uVar15;
        local_6a8 = (ulong)uVar69;
        if (uVar69 == 0) {
          return;
        }
        goto LAB_01ac1580;
      }
      lVar70 = uVar66 * 0x60;
      auVar93 = *(undefined1 (*) [32])(auStack_160 + lVar70);
      auVar180._0_4_ = fVar203 + auVar93._0_4_;
      auVar180._4_4_ = fVar222 + auVar93._4_4_;
      auVar180._8_4_ = fVar223 + auVar93._8_4_;
      auVar180._12_4_ = fVar224 + auVar93._12_4_;
      auVar180._16_4_ = fVar225 + auVar93._16_4_;
      auVar180._20_4_ = fVar145 + auVar93._20_4_;
      auVar180._24_4_ = fVar226 + auVar93._24_4_;
      auVar180._28_4_ = fVar227 + auVar93._28_4_;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar166;
      auVar33._0_4_ = uVar166;
      auVar33._8_4_ = uVar166;
      auVar33._12_4_ = uVar166;
      auVar33._16_4_ = uVar166;
      auVar33._20_4_ = uVar166;
      auVar33._24_4_ = uVar166;
      auVar33._28_4_ = uVar166;
      uVar15 = vcmpps_avx512vl(auVar180,auVar33,2);
      uVar73 = (uint)uVar15 & (uint)abStack_180[lVar70];
    } while (uVar73 == 0);
    uVar72 = (&uStack_140)[uVar66 * 0xc];
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar72;
    auVar200._8_4_ = 0x7f800000;
    auVar200._0_8_ = 0x7f8000007f800000;
    auVar200._12_4_ = 0x7f800000;
    auVar200._16_4_ = 0x7f800000;
    auVar200._20_4_ = 0x7f800000;
    auVar200._24_4_ = 0x7f800000;
    auVar200._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar200,auVar93);
    bVar61 = (byte)uVar73;
    auVar131._0_4_ =
         (uint)(bVar61 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar93._0_4_;
    bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
    auVar131._4_4_ = (uint)bVar7 * auVar94._4_4_ | (uint)!bVar7 * (int)auVar93._4_4_;
    bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
    auVar131._8_4_ = (uint)bVar7 * auVar94._8_4_ | (uint)!bVar7 * (int)auVar93._8_4_;
    bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
    auVar131._12_4_ = (uint)bVar7 * auVar94._12_4_ | (uint)!bVar7 * (int)auVar93._12_4_;
    bVar7 = (bool)((byte)(uVar73 >> 4) & 1);
    auVar131._16_4_ = (uint)bVar7 * auVar94._16_4_ | (uint)!bVar7 * (int)auVar93._16_4_;
    bVar7 = (bool)((byte)(uVar73 >> 5) & 1);
    auVar131._20_4_ = (uint)bVar7 * auVar94._20_4_ | (uint)!bVar7 * (int)auVar93._20_4_;
    bVar7 = (bool)((byte)(uVar73 >> 6) & 1);
    auVar131._24_4_ = (uint)bVar7 * auVar94._24_4_ | (uint)!bVar7 * (int)auVar93._24_4_;
    auVar131._28_4_ =
         (uVar73 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar73 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar93 = vminps_avx(auVar131,auVar93);
    auVar94 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar94);
    auVar94 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar94);
    uVar15 = vcmpps_avx512vl(auVar131,auVar93,0);
    bVar64 = (byte)uVar15 & bVar61;
    if (bVar64 != 0) {
      uVar73 = (uint)bVar64;
    }
    uVar138 = 0;
    for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
      uVar138 = uVar138 + 1;
    }
    iVar67 = aiStack_138[uVar66 * 0x18];
    bVar61 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar61;
    abStack_180[lVar70] = bVar61;
    if (bVar61 == 0) {
      uVar74 = uVar74 - 1;
    }
    uVar166 = (undefined4)uVar72;
    auVar159._4_4_ = uVar166;
    auVar159._0_4_ = uVar166;
    auVar159._8_4_ = uVar166;
    auVar159._12_4_ = uVar166;
    auVar159._16_4_ = uVar166;
    auVar159._20_4_ = uVar166;
    auVar159._24_4_ = uVar166;
    auVar159._28_4_ = uVar166;
    auVar80 = vmovshdup_avx(auVar169);
    auVar80 = vsubps_avx(auVar80,auVar169);
    auVar181._0_4_ = auVar80._0_4_;
    auVar181._4_4_ = auVar181._0_4_;
    auVar181._8_4_ = auVar181._0_4_;
    auVar181._12_4_ = auVar181._0_4_;
    auVar181._16_4_ = auVar181._0_4_;
    auVar181._20_4_ = auVar181._0_4_;
    auVar181._24_4_ = auVar181._0_4_;
    auVar181._28_4_ = auVar181._0_4_;
    auVar80 = vfmadd132ps_fma(auVar181,auVar159,_DAT_01faff20);
    auVar93 = ZEXT1632(auVar80);
    local_4c0[0] = (RTCHitN)auVar93[0];
    local_4c0[1] = (RTCHitN)auVar93[1];
    local_4c0[2] = (RTCHitN)auVar93[2];
    local_4c0[3] = (RTCHitN)auVar93[3];
    local_4c0[4] = (RTCHitN)auVar93[4];
    local_4c0[5] = (RTCHitN)auVar93[5];
    local_4c0[6] = (RTCHitN)auVar93[6];
    local_4c0[7] = (RTCHitN)auVar93[7];
    local_4c0[8] = (RTCHitN)auVar93[8];
    local_4c0[9] = (RTCHitN)auVar93[9];
    local_4c0[10] = (RTCHitN)auVar93[10];
    local_4c0[0xb] = (RTCHitN)auVar93[0xb];
    local_4c0[0xc] = (RTCHitN)auVar93[0xc];
    local_4c0[0xd] = (RTCHitN)auVar93[0xd];
    local_4c0[0xe] = (RTCHitN)auVar93[0xe];
    local_4c0[0xf] = (RTCHitN)auVar93[0xf];
    local_4c0[0x10] = (RTCHitN)auVar93[0x10];
    local_4c0[0x11] = (RTCHitN)auVar93[0x11];
    local_4c0[0x12] = (RTCHitN)auVar93[0x12];
    local_4c0[0x13] = (RTCHitN)auVar93[0x13];
    local_4c0[0x14] = (RTCHitN)auVar93[0x14];
    local_4c0[0x15] = (RTCHitN)auVar93[0x15];
    local_4c0[0x16] = (RTCHitN)auVar93[0x16];
    local_4c0[0x17] = (RTCHitN)auVar93[0x17];
    local_4c0[0x18] = (RTCHitN)auVar93[0x18];
    local_4c0[0x19] = (RTCHitN)auVar93[0x19];
    local_4c0[0x1a] = (RTCHitN)auVar93[0x1a];
    local_4c0[0x1b] = (RTCHitN)auVar93[0x1b];
    local_4c0[0x1c] = (RTCHitN)auVar93[0x1c];
    local_4c0[0x1d] = (RTCHitN)auVar93[0x1d];
    local_4c0[0x1e] = (RTCHitN)auVar93[0x1e];
    local_4c0[0x1f] = (RTCHitN)auVar93[0x1f];
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar138 * 4);
    uVar66 = (ulong)uVar74;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }